

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-opt64.c
# Opt level: O3

size_t KeccakF1600_FastLoop_Absorb(void *state,uint laneCount,uchar *data,size_t dataByteLen)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong local_158;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_98;
  
  local_d0 = *(ulong *)((long)state + 0x10);
  local_138 = *(ulong *)((long)state + 8);
  local_150 = *(ulong *)((long)state + 0x88);
  local_140 = *state;
  uVar3 = *(ulong *)((long)state + 0x70);
  local_98 = *(ulong *)((long)state + 0xa8);
  local_b8 = *(ulong *)((long)state + 0xb8);
  local_e0 = *(ulong *)((long)state + 0x20);
  local_130 = *(ulong *)((long)state + 0x18);
  local_158 = *(ulong *)((long)state + 0x98);
  local_128 = *(ulong *)((long)state + 0x30);
  local_e8 = *(ulong *)((long)state + 0x28);
  uVar29 = *(ulong *)((long)state + 0xa0);
  local_f0 = *(ulong *)((long)state + 0x40);
  local_d8 = *(ulong *)((long)state + 0x38);
  local_f8 = *(ulong *)((long)state + 0x50);
  local_120 = *(ulong *)((long)state + 0x48);
  local_118 = *(ulong *)((long)state + 0x60);
  local_100 = *(ulong *)((long)state + 0x58);
  local_108 = *(ulong *)((long)state + 0x80);
  local_148 = *(ulong *)((long)state + 0x68);
  local_110 = *(ulong *)((long)state + 0x90);
  uVar16 = *(ulong *)((long)state + 0x78);
  local_c8 = *(ulong *)((long)state + 0xb0);
  local_c0 = *(ulong *)((long)state + 0xc0);
  uVar9 = (ulong)(laneCount * 8);
  uVar15 = dataByteLen;
  if (uVar9 <= dataByteLen) {
    do {
      if (laneCount == 0x15) {
        uVar3 = uVar3 ^ *(ulong *)((long)data + 0x70);
        uVar16 = uVar16 ^ *(ulong *)((long)data + 0x78);
        uVar29 = uVar29 ^ *(ulong *)((long)data + 0xa0);
        local_140 = local_140 ^ *(ulong *)data;
        local_d0 = local_d0 ^ *(ulong *)((long)data + 0x10);
        local_118 = local_118 ^ *(ulong *)((long)data + 0x60);
        local_148 = local_148 ^ *(ulong *)((long)data + 0x68);
        local_150 = local_150 ^ *(ulong *)((long)data + 0x88);
        local_138 = local_138 ^ *(ulong *)((long)data + 8);
        local_e0 = local_e0 ^ *(ulong *)((long)data + 0x20);
        local_130 = local_130 ^ *(ulong *)((long)data + 0x18);
        local_e8 = local_e8 ^ *(ulong *)((long)data + 0x28);
        local_128 = local_128 ^ *(ulong *)((long)data + 0x30);
        local_100 = local_100 ^ *(ulong *)((long)data + 0x58);
        local_d8 = local_d8 ^ *(ulong *)((long)data + 0x38);
        local_108 = local_108 ^ *(ulong *)((long)data + 0x80);
        local_f0 = local_f0 ^ *(ulong *)((long)data + 0x40);
        local_120 = local_120 ^ *(ulong *)((long)data + 0x48);
        local_f8 = local_f8 ^ *(ulong *)((long)data + 0x50);
        local_110 = local_110 ^ *(ulong *)((long)data + 0x90);
        local_158 = local_158 ^ *(ulong *)((long)data + 0x98);
      }
      else if (laneCount < 0x10) {
        if (laneCount < 8) {
          if (laneCount < 4) {
            if (laneCount < 2) {
              if (laneCount != 0) {
                local_140 = local_140 ^ *(ulong *)data;
              }
            }
            else {
              local_140 = local_140 ^ *(ulong *)data;
              local_138 = local_138 ^ *(ulong *)((long)data + 8);
              if (laneCount == 3) {
                local_d0 = local_d0 ^ *(ulong *)((long)data + 0x10);
              }
            }
          }
          else {
            local_130 = local_130 ^ *(ulong *)((long)data + 0x18);
            local_138 = local_138 ^ *(ulong *)((long)data + 8);
            local_140 = local_140 ^ *(ulong *)data;
            local_d0 = local_d0 ^ *(ulong *)((long)data + 0x10);
            if (laneCount < 6) {
              if (laneCount != 4) {
                local_e0 = local_e0 ^ *(ulong *)((long)data + 0x20);
              }
            }
            else {
              local_e0 = local_e0 ^ *(ulong *)((long)data + 0x20);
              local_e8 = local_e8 ^ *(ulong *)((long)data + 0x28);
              if (laneCount == 7) {
                local_128 = local_128 ^ *(ulong *)((long)data + 0x30);
              }
            }
          }
        }
        else {
          local_130 = local_130 ^ *(ulong *)((long)data + 0x18);
          local_138 = local_138 ^ *(ulong *)((long)data + 8);
          local_140 = local_140 ^ *(ulong *)data;
          local_128 = local_128 ^ *(ulong *)((long)data + 0x30);
          local_d0 = local_d0 ^ *(ulong *)((long)data + 0x10);
          local_e0 = local_e0 ^ *(ulong *)((long)data + 0x20);
          local_e8 = local_e8 ^ *(ulong *)((long)data + 0x28);
          local_d8 = local_d8 ^ *(ulong *)((long)data + 0x38);
          if (laneCount < 0xc) {
            if (laneCount < 10) {
              if (laneCount != 8) {
                local_f0 = local_f0 ^ *(ulong *)((long)data + 0x40);
              }
            }
            else {
              local_120 = local_120 ^ *(ulong *)((long)data + 0x48);
              local_f0 = local_f0 ^ *(ulong *)((long)data + 0x40);
              if (laneCount == 0xb) {
                local_f8 = local_f8 ^ *(ulong *)((long)data + 0x50);
              }
            }
          }
          else {
            local_120 = local_120 ^ *(ulong *)((long)data + 0x48);
            local_f0 = local_f0 ^ *(ulong *)((long)data + 0x40);
            local_f8 = local_f8 ^ *(ulong *)((long)data + 0x50);
            local_100 = local_100 ^ *(ulong *)((long)data + 0x58);
            if (laneCount < 0xe) {
              if (laneCount != 0xc) {
                local_118 = local_118 ^ *(ulong *)((long)data + 0x60);
              }
            }
            else {
              local_118 = local_118 ^ *(ulong *)((long)data + 0x60);
              local_148 = local_148 ^ *(ulong *)((long)data + 0x68);
              if (laneCount == 0xf) {
                uVar3 = uVar3 ^ *(ulong *)((long)data + 0x70);
              }
            }
          }
        }
      }
      else {
        local_130 = local_130 ^ *(ulong *)((long)data + 0x18);
        uVar3 = uVar3 ^ *(ulong *)((long)data + 0x70);
        uVar16 = uVar16 ^ *(ulong *)((long)data + 0x78);
        local_138 = local_138 ^ *(ulong *)((long)data + 8);
        local_128 = local_128 ^ *(ulong *)((long)data + 0x30);
        local_140 = local_140 ^ *(ulong *)data;
        local_118 = local_118 ^ *(ulong *)((long)data + 0x60);
        local_148 = local_148 ^ *(ulong *)((long)data + 0x68);
        local_d0 = local_d0 ^ *(ulong *)((long)data + 0x10);
        local_f0 = local_f0 ^ *(ulong *)((long)data + 0x40);
        local_e0 = local_e0 ^ *(ulong *)((long)data + 0x20);
        local_e8 = local_e8 ^ *(ulong *)((long)data + 0x28);
        local_d8 = local_d8 ^ *(ulong *)((long)data + 0x38);
        local_120 = local_120 ^ *(ulong *)((long)data + 0x48);
        local_f8 = local_f8 ^ *(ulong *)((long)data + 0x50);
        local_100 = local_100 ^ *(ulong *)((long)data + 0x58);
        if (laneCount < 0x18) {
          if (laneCount < 0x14) {
            if (laneCount < 0x12) {
              if (laneCount != 0x10) {
                local_108 = local_108 ^ *(ulong *)((long)data + 0x80);
              }
            }
            else {
              local_150 = local_150 ^ *(ulong *)((long)data + 0x88);
              local_108 = local_108 ^ *(ulong *)((long)data + 0x80);
              if (laneCount == 0x13) {
                local_110 = local_110 ^ *(ulong *)((long)data + 0x90);
              }
            }
          }
          else {
            local_150 = local_150 ^ *(ulong *)((long)data + 0x88);
            local_108 = local_108 ^ *(ulong *)((long)data + 0x80);
            local_110 = local_110 ^ *(ulong *)((long)data + 0x90);
            local_158 = local_158 ^ *(ulong *)((long)data + 0x98);
            if (0x15 < laneCount) {
              uVar29 = uVar29 ^ *(ulong *)((long)data + 0xa0);
              local_98 = local_98 ^ *(ulong *)((long)data + 0xa8);
              if (laneCount == 0x17) {
                local_c8 = local_c8 ^ *(ulong *)((long)data + 0xb0);
              }
            }
          }
        }
        else {
          local_b8 = local_b8 ^ *(ulong *)((long)data + 0xb8);
          uVar29 = uVar29 ^ *(ulong *)((long)data + 0xa0);
          local_110 = local_110 ^ *(ulong *)((long)data + 0x90);
          local_150 = local_150 ^ *(ulong *)((long)data + 0x88);
          local_108 = local_108 ^ *(ulong *)((long)data + 0x80);
          local_158 = local_158 ^ *(ulong *)((long)data + 0x98);
          local_98 = local_98 ^ *(ulong *)((long)data + 0xa8);
          local_c8 = local_c8 ^ *(ulong *)((long)data + 0xb0);
          if (laneCount != 0x18) {
            local_c0 = local_c0 ^ *(ulong *)((long)data + 0xc0);
          }
        }
      }
      uVar22 = local_118 ^ local_d8 ^ local_150 ^ local_c8 ^ local_d0;
      uVar10 = local_100 ^ local_128 ^ local_108 ^ local_98 ^ local_138;
      uVar30 = uVar3 ^ local_120 ^ local_158 ^ local_c0 ^ local_e0;
      uVar2 = (uVar10 >> 0x3f | uVar10 << 1) ^ uVar30;
      uVar7 = local_f8 ^ local_e8 ^ uVar16 ^ uVar29 ^ local_140;
      uVar31 = (uVar22 >> 0x3f | uVar22 << 1) ^ uVar7;
      uVar22 = (uVar30 >> 0x3f | uVar30 << 1) ^ uVar22;
      uVar30 = local_148 ^ local_f0 ^ local_110 ^ local_b8 ^ local_130;
      uVar8 = (uVar7 >> 0x3f | uVar7 << 1) ^ uVar30;
      uVar10 = (uVar30 >> 0x3f | uVar30 << 1) ^ uVar10;
      local_140 = local_140 ^ uVar2;
      uVar11 = (local_128 ^ uVar31) >> 0x14 | (local_128 ^ uVar31) << 0x2c;
      uVar30 = (local_110 ^ uVar22) >> 0x2b | (local_110 ^ uVar22) << 0x15;
      uVar7 = (local_c0 ^ uVar8) >> 0x32 | (local_c0 ^ uVar8) << 0xe;
      uVar23 = (local_118 ^ uVar10) >> 0x15 | (local_118 ^ uVar10) << 0x2b;
      uVar17 = ~uVar7 & local_140 ^ uVar30;
      uVar18 = ~uVar23 & uVar30 ^ uVar11;
      uVar4 = ~uVar30 & uVar7 ^ uVar23;
      uVar7 = ~local_140 & uVar11 ^ uVar7;
      uVar30 = (local_130 ^ uVar22) >> 0x24 | (local_130 ^ uVar22) << 0x1c;
      uVar40 = (local_108 ^ uVar31) >> 0x13 | (local_108 ^ uVar31) << 0x2d;
      uVar12 = (local_120 ^ uVar8) >> 0x2c | (local_120 ^ uVar8) << 0x14;
      uVar24 = (local_f8 ^ uVar2) >> 0x3d | (local_f8 ^ uVar2) << 3;
      uVar36 = (local_c8 ^ uVar10) >> 3 | (local_c8 ^ uVar10) << 0x3d;
      uVar19 = ~uVar24 & uVar40 ^ uVar12;
      uVar5 = ~uVar40 & uVar36 ^ uVar24;
      uVar40 = ~uVar36 & uVar30 ^ uVar40;
      uVar25 = ~uVar12 & uVar24 ^ uVar30;
      uVar36 = ~uVar30 & uVar12 ^ uVar36;
      uVar30 = (local_138 ^ uVar31) >> 0x3f | (local_138 ^ uVar31) << 1;
      uVar37 = (local_158 ^ uVar8) >> 0x38 | (local_158 ^ uVar8) << 8;
      uVar24 = (local_d8 ^ uVar10) >> 0x3a | (local_d8 ^ uVar10) << 6;
      uVar26 = (local_148 ^ uVar22) >> 0x27 | (local_148 ^ uVar22) << 0x19;
      uVar20 = ~uVar24 & uVar26 ^ uVar30;
      uVar6 = ~uVar26 & uVar37 ^ uVar24;
      uVar12 = (uVar29 ^ uVar2) >> 0x2e | (uVar29 ^ uVar2) << 0x12;
      uVar29 = ~uVar30 & uVar24 ^ uVar12;
      uVar1 = ~uVar12 & uVar30 ^ uVar37;
      uVar26 = ~uVar37 & uVar12 ^ uVar26;
      uVar33 = (local_150 ^ uVar10) >> 0x31 | (local_150 ^ uVar10) << 0xf;
      uVar13 = (local_100 ^ uVar31) >> 0x36 | (local_100 ^ uVar31) << 10;
      uVar24 = (local_b8 ^ uVar22) >> 8 | (local_b8 ^ uVar22) << 0x38;
      uVar32 = (uVar22 ^ local_f0) >> 9 | (uVar22 ^ local_f0) << 0x37;
      uVar38 = ~uVar11 & uVar23 ^ local_140 ^ 1;
      uVar12 = (local_e8 ^ uVar2) >> 0x1c | (local_e8 ^ uVar2) << 0x24;
      uVar30 = (local_e0 ^ uVar8) >> 0x25 | (local_e0 ^ uVar8) << 0x1b;
      uVar37 = ~uVar13 & uVar33 ^ uVar12;
      uVar11 = ~uVar12 & uVar13 ^ uVar30;
      uVar22 = ~uVar24 & uVar30 ^ uVar33;
      uVar30 = ~uVar30 & uVar12 ^ uVar24;
      uVar23 = (uVar31 ^ local_98) >> 0x3e | (uVar31 ^ local_98) << 2;
      uVar13 = ~uVar33 & uVar24 ^ uVar13;
      uVar24 = (uVar10 ^ local_d0) >> 2 | (uVar10 ^ local_d0) << 0x3e;
      uVar16 = (uVar2 ^ uVar16) >> 0x17 | (uVar2 ^ uVar16) << 0x29;
      uVar12 = (uVar8 ^ uVar3) >> 0x19 | (uVar8 ^ uVar3) << 0x27;
      uVar31 = ~uVar32 & uVar12 ^ uVar24;
      uVar34 = ~uVar12 & uVar16 ^ uVar32;
      uVar2 = uVar25 ^ uVar31 ^ uVar20 ^ uVar11 ^ uVar38;
      uVar12 = ~uVar16 & uVar23 ^ uVar12;
      uVar10 = uVar37 ^ uVar6 ^ uVar19 ^ uVar18 ^ uVar34;
      uVar16 = ~uVar23 & uVar24 ^ uVar16;
      uVar21 = uVar12 ^ uVar4 ^ uVar5 ^ uVar13 ^ uVar26;
      uVar23 = ~uVar24 & uVar32 ^ uVar23;
      uVar3 = uVar16 ^ uVar17 ^ uVar1 ^ uVar40 ^ uVar22;
      uVar32 = uVar29 ^ uVar36 ^ uVar7 ^ uVar23 ^ uVar30;
      uVar8 = (uVar3 >> 0x3f | uVar3 << 1) ^ uVar10;
      uVar26 = uVar26 ^ uVar8;
      uVar12 = uVar12 ^ uVar8;
      uVar14 = (uVar21 >> 0x3f | uVar21 << 1) ^ uVar2;
      uVar24 = uVar12 >> 3 | uVar12 << 0x3d;
      uVar33 = (uVar10 >> 0x3f | uVar10 << 1) ^ uVar32;
      uVar38 = uVar38 ^ uVar33;
      uVar21 = (uVar32 >> 0x3f | uVar32 << 1) ^ uVar21;
      uVar10 = uVar26 >> 0x15 | uVar26 << 0x2b;
      uVar3 = (uVar2 >> 0x3f | uVar2 << 1) ^ uVar3;
      uVar22 = uVar22 ^ uVar21;
      uVar23 = uVar23 ^ uVar3;
      uVar26 = uVar22 >> 0x2b | uVar22 << 0x15;
      uVar12 = uVar23 >> 0x32 | uVar23 << 0xe;
      uVar19 = uVar19 ^ uVar14;
      uVar2 = uVar19 >> 0x14 | uVar19 << 0x2c;
      uVar22 = ~uVar12 & uVar38 ^ uVar26;
      uVar23 = ~uVar10 & uVar26 ^ uVar2;
      uVar26 = ~uVar26 & uVar12 ^ uVar10;
      uVar12 = ~uVar38 & uVar2 ^ uVar12;
      uVar37 = uVar37 ^ uVar14;
      uVar20 = uVar20 ^ uVar33;
      uVar17 = uVar17 ^ uVar21;
      uVar27 = uVar20 >> 0x3d | uVar20 << 3;
      uVar19 = uVar37 >> 0x13 | uVar37 << 0x2d;
      uVar20 = uVar17 >> 0x24 | uVar17 << 0x1c;
      uVar32 = ~uVar24 & uVar20 ^ uVar19;
      uVar37 = ~uVar19 & uVar24 ^ uVar27;
      uVar36 = uVar36 ^ uVar3;
      uVar17 = uVar36 >> 0x2c | uVar36 << 0x14;
      uVar36 = ~uVar27 & uVar19 ^ uVar17;
      uVar19 = ~uVar17 & uVar27 ^ uVar20;
      uVar24 = ~uVar20 & uVar17 ^ uVar24;
      uVar30 = uVar30 ^ uVar3;
      uVar5 = uVar5 ^ uVar8;
      uVar28 = uVar30 >> 0x38 | uVar30 << 8;
      uVar1 = uVar1 ^ uVar21;
      uVar17 = uVar5 >> 0x3a | uVar5 << 6;
      uVar18 = uVar18 ^ uVar14;
      uVar1 = uVar1 >> 0x27 | uVar1 << 0x19;
      uVar30 = uVar18 >> 0x3f | uVar18 << 1;
      uVar20 = ~uVar1 & uVar28 ^ uVar17;
      uVar31 = uVar31 ^ uVar33;
      uVar18 = uVar31 >> 0x2e | uVar31 << 0x12;
      uVar27 = ~uVar18 & uVar30 ^ uVar28;
      uVar5 = ~uVar28 & uVar18 ^ uVar1;
      uVar1 = ~uVar17 & uVar1 ^ uVar30;
      uVar18 = ~uVar30 & uVar17 ^ uVar18;
      uVar25 = uVar25 ^ uVar33;
      uVar6 = uVar6 ^ uVar14;
      uVar31 = uVar25 >> 0x1c | uVar25 << 0x24;
      uVar14 = uVar14 ^ uVar34;
      uVar6 = uVar6 >> 0x36 | uVar6 << 10;
      uVar13 = uVar13 ^ uVar8;
      uVar17 = uVar13 >> 0x31 | uVar13 << 0xf;
      uVar16 = uVar16 ^ uVar21;
      uVar21 = uVar21 ^ uVar40;
      uVar40 = uVar16 >> 8 | uVar16 << 0x38;
      uVar16 = ~uVar6 & uVar17 ^ uVar31;
      uVar30 = ~uVar17 & uVar40 ^ uVar6;
      uVar7 = uVar7 ^ uVar3;
      uVar3 = uVar3 ^ uVar29;
      uVar13 = uVar21 >> 9 | uVar21 << 0x37;
      uVar29 = uVar7 >> 0x25 | uVar7 << 0x1b;
      uVar28 = ~uVar31 & uVar6 ^ uVar29;
      uVar6 = uVar3 >> 0x19 | uVar3 << 0x27;
      uVar3 = ~uVar29 & uVar31 ^ uVar40;
      uVar17 = ~uVar40 & uVar29 ^ uVar17;
      uVar33 = uVar33 ^ uVar11;
      uVar8 = uVar8 ^ uVar4;
      uVar40 = uVar14 >> 0x3e | uVar14 << 2;
      uVar7 = uVar8 >> 2 | uVar8 << 0x3e;
      uVar10 = ~uVar2 & uVar10 ^ uVar38 ^ 0x8082;
      uVar29 = ~uVar13 & uVar6 ^ uVar7;
      uVar8 = uVar28 ^ uVar29 ^ uVar19 ^ uVar1 ^ uVar10;
      uVar2 = uVar33 >> 0x17 | uVar33 << 0x29;
      uVar11 = ~uVar7 & uVar13 ^ uVar40;
      uVar7 = ~uVar40 & uVar7 ^ uVar2;
      uVar31 = ~uVar2 & uVar40 ^ uVar6;
      uVar40 = uVar18 ^ uVar3 ^ uVar12 ^ uVar24 ^ uVar11;
      uVar25 = uVar27 ^ uVar17 ^ uVar22 ^ uVar32 ^ uVar7;
      uVar13 = ~uVar6 & uVar2 ^ uVar13;
      uVar4 = uVar5 ^ uVar30 ^ uVar26 ^ uVar37 ^ uVar31;
      uVar2 = uVar20 ^ uVar16 ^ uVar23 ^ uVar36 ^ uVar13;
      uVar14 = (uVar40 >> 0x3f | uVar40 << 1) ^ uVar4;
      uVar21 = (uVar25 >> 0x3f | uVar25 << 1) ^ uVar2;
      uVar40 = (uVar2 >> 0x3f | uVar2 << 1) ^ uVar40;
      uVar38 = (uVar4 >> 0x3f | uVar4 << 1) ^ uVar8;
      uVar17 = uVar17 ^ uVar14;
      uVar31 = uVar31 ^ uVar21;
      uVar25 = (uVar8 >> 0x3f | uVar8 << 1) ^ uVar25;
      uVar5 = uVar5 ^ uVar21;
      uVar10 = uVar10 ^ uVar40;
      uVar8 = uVar5 >> 0x15 | uVar5 << 0x2b;
      uVar11 = uVar11 ^ uVar25;
      uVar4 = uVar11 >> 0x32 | uVar11 << 0xe;
      uVar36 = uVar36 ^ uVar38;
      uVar2 = uVar36 >> 0x14 | uVar36 << 0x2c;
      uVar36 = uVar10 ^ 0x800000000000808a ^ ~uVar2 & uVar8;
      uVar17 = uVar17 >> 0x2b | uVar17 << 0x15;
      uVar34 = ~uVar17 & uVar4 ^ uVar8;
      uVar8 = ~uVar8 & uVar17 ^ uVar2;
      uVar17 = ~uVar4 & uVar10 ^ uVar17;
      uVar5 = uVar31 >> 3 | uVar31 << 0x3d;
      uVar4 = ~uVar10 & uVar2 ^ uVar4;
      uVar16 = uVar16 ^ uVar38;
      uVar11 = uVar16 >> 0x13 | uVar16 << 0x2d;
      uVar22 = uVar22 ^ uVar14;
      uVar1 = uVar1 ^ uVar40;
      uVar16 = uVar22 >> 0x24 | uVar22 << 0x1c;
      uVar24 = uVar24 ^ uVar25;
      uVar1 = uVar1 >> 0x3d | uVar1 << 3;
      uVar2 = uVar24 >> 0x2c | uVar24 << 0x14;
      uVar22 = ~uVar11 & uVar5 ^ uVar1;
      uVar39 = ~uVar5 & uVar16 ^ uVar11;
      uVar10 = ~uVar1 & uVar11 ^ uVar2;
      uVar31 = ~uVar2 & uVar1 ^ uVar16;
      uVar5 = ~uVar16 & uVar2 ^ uVar5;
      uVar29 = uVar29 ^ uVar40;
      uVar23 = uVar23 ^ uVar38;
      uVar3 = uVar3 ^ uVar25;
      uVar1 = uVar29 >> 0x2e | uVar29 << 0x12;
      uVar16 = uVar23 >> 0x3f | uVar23 << 1;
      uVar37 = uVar37 ^ uVar21;
      uVar27 = uVar27 ^ uVar14;
      uVar24 = uVar3 >> 0x38 | uVar3 << 8;
      uVar2 = uVar37 >> 0x3a | uVar37 << 6;
      uVar29 = uVar27 >> 0x27 | uVar27 << 0x19;
      uVar3 = ~uVar1 & uVar16 ^ uVar24;
      uVar6 = ~uVar24 & uVar1 ^ uVar29;
      uVar33 = ~uVar2 & uVar29 ^ uVar16;
      uVar29 = ~uVar29 & uVar24 ^ uVar2;
      uVar1 = ~uVar16 & uVar2 ^ uVar1;
      uVar20 = uVar20 ^ uVar38;
      uVar38 = uVar38 ^ uVar13;
      uVar12 = uVar12 ^ uVar25;
      uVar11 = uVar20 >> 0x36 | uVar20 << 10;
      uVar25 = uVar25 ^ uVar18;
      uVar19 = uVar19 ^ uVar40;
      uVar12 = uVar12 >> 0x25 | uVar12 << 0x1b;
      uVar40 = uVar40 ^ uVar28;
      uVar24 = uVar19 >> 0x1c | uVar19 << 0x24;
      uVar16 = ~uVar24 & uVar11 ^ uVar12;
      uVar30 = uVar30 ^ uVar21;
      uVar21 = uVar21 ^ uVar26;
      uVar18 = uVar30 >> 0x31 | uVar30 << 0xf;
      uVar30 = ~uVar11 & uVar18 ^ uVar24;
      uVar19 = uVar21 >> 2 | uVar21 << 0x3e;
      uVar7 = uVar7 ^ uVar14;
      uVar14 = uVar14 ^ uVar32;
      uVar7 = uVar7 >> 8 | uVar7 << 0x38;
      uVar2 = uVar38 >> 0x3e | uVar38 << 2;
      uVar11 = ~uVar18 & uVar7 ^ uVar11;
      uVar23 = ~uVar12 & uVar24 ^ uVar7;
      uVar18 = ~uVar7 & uVar12 ^ uVar18;
      uVar12 = uVar40 >> 0x17 | uVar40 << 0x29;
      uVar7 = uVar14 >> 9 | uVar14 << 0x37;
      uVar24 = uVar25 >> 0x19 | uVar25 << 0x27;
      uVar37 = ~uVar2 & uVar19 ^ uVar12;
      uVar35 = ~uVar24 & uVar12 ^ uVar7;
      uVar12 = ~uVar12 & uVar2 ^ uVar24;
      uVar2 = ~uVar19 & uVar7 ^ uVar2;
      uVar40 = uVar29 ^ uVar30 ^ uVar8 ^ uVar10 ^ uVar35;
      uVar19 = ~uVar7 & uVar24 ^ uVar19;
      uVar20 = uVar6 ^ uVar11 ^ uVar34 ^ uVar22 ^ uVar12;
      uVar38 = uVar33 ^ uVar16 ^ uVar36 ^ uVar31 ^ uVar19;
      uVar32 = uVar1 ^ uVar23 ^ uVar4 ^ uVar5 ^ uVar2;
      uVar7 = uVar3 ^ uVar18 ^ uVar17 ^ uVar39 ^ uVar37;
      uVar25 = (uVar32 >> 0x3f | uVar32 << 1) ^ uVar20;
      uVar21 = (uVar38 >> 0x3f | uVar38 << 1) ^ uVar7;
      uVar18 = uVar18 ^ uVar25;
      uVar13 = (uVar7 >> 0x3f | uVar7 << 1) ^ uVar40;
      uVar2 = uVar2 ^ uVar21;
      uVar24 = uVar18 >> 0x2b | uVar18 << 0x15;
      uVar7 = uVar2 >> 0x32 | uVar2 << 0xe;
      uVar12 = uVar12 ^ uVar13;
      uVar32 = (uVar40 >> 0x3f | uVar40 << 1) ^ uVar32;
      uVar38 = (uVar20 >> 0x3f | uVar20 << 1) ^ uVar38;
      uVar2 = uVar12 >> 3 | uVar12 << 0x3d;
      uVar19 = uVar19 ^ uVar32;
      uVar10 = uVar10 ^ uVar38;
      uVar12 = uVar19 >> 0x2e | uVar19 << 0x12;
      uVar40 = uVar10 >> 0x14 | uVar10 << 0x2c;
      uVar6 = uVar6 ^ uVar13;
      uVar18 = uVar6 >> 0x15 | uVar6 << 0x2b;
      uVar36 = uVar36 ^ uVar32;
      uVar28 = uVar36 ^ 0x8000000080008000 ^ ~uVar40 & uVar18;
      uVar27 = ~uVar24 & uVar7 ^ uVar18;
      uVar18 = ~uVar18 & uVar24 ^ uVar40;
      uVar40 = ~uVar36 & uVar40 ^ uVar7;
      uVar24 = ~uVar7 & uVar36 ^ uVar24;
      uVar30 = uVar30 ^ uVar38;
      uVar10 = uVar30 >> 0x13 | uVar30 << 0x2d;
      uVar33 = uVar33 ^ uVar32;
      uVar17 = uVar17 ^ uVar25;
      uVar36 = uVar33 >> 0x3d | uVar33 << 3;
      uVar23 = uVar23 ^ uVar21;
      uVar7 = uVar17 >> 0x24 | uVar17 << 0x1c;
      uVar14 = ~uVar2 & uVar7 ^ uVar10;
      uVar17 = ~uVar10 & uVar2 ^ uVar36;
      uVar5 = uVar5 ^ uVar21;
      uVar30 = uVar5 >> 0x2c | uVar5 << 0x14;
      uVar10 = ~uVar36 & uVar10 ^ uVar30;
      uVar26 = ~uVar30 & uVar36 ^ uVar7;
      uVar2 = ~uVar7 & uVar30 ^ uVar2;
      uVar20 = uVar23 >> 0x38 | uVar23 << 8;
      uVar22 = uVar22 ^ uVar13;
      uVar3 = uVar3 ^ uVar25;
      uVar7 = uVar22 >> 0x3a | uVar22 << 6;
      uVar8 = uVar8 ^ uVar38;
      uVar36 = uVar3 >> 0x27 | uVar3 << 0x19;
      uVar3 = uVar8 >> 0x3f | uVar8 << 1;
      uVar30 = ~uVar20 & uVar12 ^ uVar36;
      uVar6 = ~uVar7 & uVar36 ^ uVar3;
      uVar5 = ~uVar36 & uVar20 ^ uVar7;
      uVar20 = ~uVar12 & uVar3 ^ uVar20;
      uVar12 = ~uVar3 & uVar7 ^ uVar12;
      uVar4 = uVar4 ^ uVar21;
      uVar31 = uVar31 ^ uVar32;
      uVar21 = uVar21 ^ uVar1;
      uVar7 = uVar4 >> 0x25 | uVar4 << 0x1b;
      uVar36 = uVar31 >> 0x1c | uVar31 << 0x24;
      uVar23 = uVar21 >> 0x19 | uVar21 << 0x27;
      uVar29 = uVar29 ^ uVar38;
      uVar38 = uVar38 ^ uVar35;
      uVar8 = uVar29 >> 0x36 | uVar29 << 10;
      uVar21 = ~uVar36 & uVar8 ^ uVar7;
      uVar11 = uVar11 ^ uVar13;
      uVar13 = uVar13 ^ uVar34;
      uVar29 = uVar11 >> 0x31 | uVar11 << 0xf;
      uVar19 = ~uVar8 & uVar29 ^ uVar36;
      uVar37 = uVar37 ^ uVar25;
      uVar25 = uVar25 ^ uVar39;
      uVar3 = uVar37 >> 8 | uVar37 << 0x38;
      uVar11 = uVar38 >> 0x3e | uVar38 << 2;
      uVar31 = ~uVar7 & uVar36 ^ uVar3;
      uVar8 = ~uVar29 & uVar3 ^ uVar8;
      uVar29 = ~uVar3 & uVar7 ^ uVar29;
      uVar32 = uVar32 ^ uVar16;
      uVar16 = uVar32 >> 0x17 | uVar32 << 0x29;
      uVar22 = uVar13 >> 2 | uVar13 << 0x3e;
      uVar3 = uVar25 >> 9 | uVar25 << 0x37;
      uVar36 = ~uVar11 & uVar22 ^ uVar16;
      uVar13 = ~uVar23 & uVar16 ^ uVar3;
      uVar16 = ~uVar16 & uVar11 ^ uVar23;
      uVar1 = uVar20 ^ uVar29 ^ uVar24 ^ uVar14 ^ uVar36;
      uVar11 = ~uVar22 & uVar3 ^ uVar11;
      uVar7 = uVar5 ^ uVar19 ^ uVar18 ^ uVar10 ^ uVar13;
      uVar22 = ~uVar3 & uVar23 ^ uVar22;
      uVar38 = uVar30 ^ uVar8 ^ uVar27 ^ uVar17 ^ uVar16;
      uVar4 = uVar12 ^ uVar31 ^ uVar40 ^ uVar2 ^ uVar11;
      uVar35 = (uVar1 >> 0x3f | uVar1 << 1) ^ uVar7;
      uVar3 = uVar6 ^ uVar21 ^ uVar28 ^ uVar26 ^ uVar22;
      uVar23 = (uVar7 >> 0x3f | uVar7 << 1) ^ uVar4;
      uVar34 = (uVar38 >> 0x3f | uVar38 << 1) ^ uVar3;
      uVar38 = (uVar4 >> 0x3f | uVar4 << 1) ^ uVar38;
      uVar16 = uVar16 ^ uVar35;
      uVar22 = uVar22 ^ uVar23;
      uVar1 = (uVar3 >> 0x3f | uVar3 << 1) ^ uVar1;
      uVar29 = uVar29 ^ uVar38;
      uVar7 = uVar16 >> 3 | uVar16 << 0x3d;
      uVar11 = uVar11 ^ uVar1;
      uVar16 = uVar29 >> 0x2b | uVar29 << 0x15;
      uVar28 = uVar28 ^ uVar23;
      uVar10 = uVar10 ^ uVar34;
      uVar3 = uVar10 >> 0x14 | uVar10 << 0x2c;
      uVar29 = uVar11 >> 0x32 | uVar11 << 0xe;
      uVar30 = uVar30 ^ uVar35;
      uVar11 = uVar30 >> 0x15 | uVar30 << 0x2b;
      uVar32 = ~uVar29 & uVar28 ^ uVar16;
      uVar10 = ~uVar11 & uVar16 ^ uVar3;
      uVar4 = ~uVar16 & uVar29 ^ uVar11;
      uVar29 = ~uVar28 & uVar3 ^ uVar29;
      uVar2 = uVar2 ^ uVar1;
      uVar2 = uVar2 >> 0x2c | uVar2 << 0x14;
      uVar6 = uVar6 ^ uVar23;
      uVar24 = uVar24 ^ uVar38;
      uVar6 = uVar6 >> 0x3d | uVar6 << 3;
      uVar16 = uVar24 >> 0x24 | uVar24 << 0x1c;
      uVar19 = uVar19 ^ uVar34;
      uVar24 = uVar19 >> 0x13 | uVar19 << 0x2d;
      uVar37 = ~uVar7 & uVar16 ^ uVar24;
      uVar30 = uVar22 >> 0x2e | uVar22 << 0x12;
      uVar22 = ~uVar24 & uVar7 ^ uVar6;
      uVar19 = ~uVar6 & uVar24 ^ uVar2;
      uVar6 = ~uVar2 & uVar6 ^ uVar16;
      uVar7 = ~uVar16 & uVar2 ^ uVar7;
      uVar17 = uVar17 ^ uVar35;
      uVar20 = uVar20 ^ uVar38;
      uVar2 = uVar17 >> 0x3a | uVar17 << 6;
      uVar24 = uVar20 >> 0x27 | uVar20 << 0x19;
      uVar18 = uVar18 ^ uVar34;
      uVar16 = uVar18 >> 0x3f | uVar18 << 1;
      uVar31 = uVar31 ^ uVar1;
      uVar18 = uVar31 >> 0x38 | uVar31 << 8;
      uVar25 = ~uVar30 & uVar16 ^ uVar18;
      uVar20 = ~uVar18 & uVar30 ^ uVar24;
      uVar31 = ~uVar2 & uVar24 ^ uVar16;
      uVar33 = ~uVar24 & uVar18 ^ uVar2;
      uVar30 = ~uVar16 & uVar2 ^ uVar30;
      uVar5 = uVar5 ^ uVar34;
      uVar34 = uVar34 ^ uVar13;
      uVar8 = uVar8 ^ uVar35;
      uVar26 = uVar26 ^ uVar23;
      uVar24 = uVar5 >> 0x36 | uVar5 << 10;
      uVar35 = uVar35 ^ uVar27;
      uVar5 = uVar8 >> 0x31 | uVar8 << 0xf;
      uVar18 = uVar26 >> 0x1c | uVar26 << 0x24;
      uVar16 = ~uVar24 & uVar5 ^ uVar18;
      uVar36 = uVar36 ^ uVar38;
      uVar38 = uVar38 ^ uVar14;
      uVar17 = uVar36 >> 8 | uVar36 << 0x38;
      uVar40 = uVar40 ^ uVar1;
      uVar1 = uVar1 ^ uVar12;
      uVar36 = uVar40 >> 0x25 | uVar40 << 0x1b;
      uVar2 = ~uVar5 & uVar17 ^ uVar24;
      uVar5 = ~uVar17 & uVar36 ^ uVar5;
      uVar1 = uVar1 >> 0x19 | uVar1 << 0x27;
      uVar14 = ~uVar18 & uVar24 ^ uVar36;
      uVar17 = ~uVar36 & uVar18 ^ uVar17;
      uVar23 = uVar23 ^ uVar21;
      uVar28 = ~uVar3 & uVar11 ^ uVar28 ^ 0x808b;
      uVar12 = uVar35 >> 2 | uVar35 << 0x3e;
      uVar3 = uVar38 >> 9 | uVar38 << 0x37;
      uVar8 = uVar23 >> 0x17 | uVar23 << 0x29;
      uVar27 = ~uVar3 & uVar1 ^ uVar12;
      uVar13 = ~uVar1 & uVar8 ^ uVar3;
      uVar24 = uVar34 >> 0x3e | uVar34 << 2;
      uVar18 = uVar33 ^ uVar16 ^ uVar10 ^ uVar19 ^ uVar13;
      uVar36 = uVar14 ^ uVar27 ^ uVar6 ^ uVar31 ^ uVar28;
      uVar1 = ~uVar8 & uVar24 ^ uVar1;
      uVar3 = ~uVar12 & uVar3 ^ uVar24;
      uVar21 = uVar20 ^ uVar2 ^ uVar4 ^ uVar22 ^ uVar1;
      uVar8 = ~uVar24 & uVar12 ^ uVar8;
      uVar24 = uVar30 ^ uVar17 ^ uVar29 ^ uVar7 ^ uVar3;
      uVar12 = uVar25 ^ uVar5 ^ uVar32 ^ uVar37 ^ uVar8;
      uVar38 = (uVar21 >> 0x3f | uVar21 << 1) ^ uVar36;
      uVar21 = (uVar24 >> 0x3f | uVar24 << 1) ^ uVar21;
      uVar34 = (uVar36 >> 0x3f | uVar36 << 1) ^ uVar12;
      uVar11 = (uVar12 >> 0x3f | uVar12 << 1) ^ uVar18;
      uVar3 = uVar3 ^ uVar34;
      uVar5 = uVar5 ^ uVar21;
      uVar24 = (uVar18 >> 0x3f | uVar18 << 1) ^ uVar24;
      uVar40 = uVar5 >> 0x2b | uVar5 << 0x15;
      uVar3 = uVar3 >> 0x32 | uVar3 << 0xe;
      uVar1 = uVar1 ^ uVar11;
      uVar28 = uVar28 ^ uVar24;
      uVar19 = uVar19 ^ uVar38;
      uVar18 = uVar19 >> 0x14 | uVar19 << 0x2c;
      uVar20 = uVar20 ^ uVar11;
      uVar36 = uVar20 >> 0x15 | uVar20 << 0x2b;
      uVar26 = ~uVar40 & uVar3 ^ uVar36;
      uVar5 = ~uVar36 & uVar40 ^ uVar18;
      uVar12 = uVar28 ^ 0x80000001 ^ ~uVar18 & uVar36;
      uVar36 = uVar1 >> 3 | uVar1 << 0x3d;
      uVar18 = ~uVar28 & uVar18 ^ uVar3;
      uVar40 = ~uVar3 & uVar28 ^ uVar40;
      uVar16 = uVar16 ^ uVar38;
      uVar1 = uVar16 >> 0x13 | uVar16 << 0x2d;
      uVar7 = uVar7 ^ uVar34;
      uVar32 = uVar32 ^ uVar21;
      uVar16 = uVar7 >> 0x2c | uVar7 << 0x14;
      uVar3 = uVar32 >> 0x24 | uVar32 << 0x1c;
      uVar32 = ~uVar36 & uVar3 ^ uVar1;
      uVar31 = uVar31 ^ uVar24;
      uVar7 = uVar31 >> 0x3d | uVar31 << 3;
      uVar31 = ~uVar1 & uVar36 ^ uVar7;
      uVar23 = ~uVar16 & uVar7 ^ uVar3;
      uVar20 = ~uVar7 & uVar1 ^ uVar16;
      uVar36 = ~uVar3 & uVar16 ^ uVar36;
      uVar17 = uVar17 ^ uVar34;
      uVar10 = uVar10 ^ uVar38;
      uVar19 = uVar17 >> 0x38 | uVar17 << 8;
      uVar3 = uVar10 >> 0x3f | uVar10 << 1;
      uVar25 = uVar25 ^ uVar21;
      uVar1 = uVar25 >> 0x27 | uVar25 << 0x19;
      uVar27 = uVar27 ^ uVar24;
      uVar22 = uVar22 ^ uVar11;
      uVar16 = uVar27 >> 0x2e | uVar27 << 0x12;
      uVar7 = uVar22 >> 0x3a | uVar22 << 6;
      uVar28 = ~uVar1 & uVar19 ^ uVar7;
      uVar27 = ~uVar19 & uVar16 ^ uVar1;
      uVar19 = ~uVar16 & uVar3 ^ uVar19;
      uVar1 = ~uVar7 & uVar1 ^ uVar3;
      uVar16 = ~uVar3 & uVar7 ^ uVar16;
      uVar6 = uVar6 ^ uVar24;
      uVar17 = uVar6 >> 0x1c | uVar6 << 0x24;
      uVar29 = uVar29 ^ uVar34;
      uVar34 = uVar34 ^ uVar30;
      uVar30 = uVar29 >> 0x25 | uVar29 << 0x1b;
      uVar33 = uVar33 ^ uVar38;
      uVar38 = uVar38 ^ uVar13;
      uVar10 = uVar33 >> 0x36 | uVar33 << 10;
      uVar3 = ~uVar17 & uVar10 ^ uVar30;
      uVar13 = uVar38 >> 0x3e | uVar38 << 2;
      uVar2 = uVar2 ^ uVar11;
      uVar11 = uVar11 ^ uVar4;
      uVar22 = uVar2 >> 0x31 | uVar2 << 0xf;
      uVar8 = uVar8 ^ uVar21;
      uVar21 = uVar21 ^ uVar37;
      uVar29 = ~uVar10 & uVar22 ^ uVar17;
      uVar7 = uVar8 >> 8 | uVar8 << 0x38;
      uVar2 = uVar34 >> 0x19 | uVar34 << 0x27;
      uVar10 = ~uVar22 & uVar7 ^ uVar10;
      uVar22 = ~uVar7 & uVar30 ^ uVar22;
      uVar7 = ~uVar30 & uVar17 ^ uVar7;
      uVar24 = uVar24 ^ uVar14;
      uVar8 = uVar21 >> 9 | uVar21 << 0x37;
      uVar6 = uVar24 >> 0x17 | uVar24 << 0x29;
      uVar14 = ~uVar2 & uVar6 ^ uVar8;
      uVar37 = uVar28 ^ uVar29 ^ uVar5 ^ uVar20 ^ uVar14;
      uVar30 = uVar11 >> 2 | uVar11 << 0x3e;
      uVar24 = ~uVar6 & uVar13 ^ uVar2;
      uVar6 = ~uVar13 & uVar30 ^ uVar6;
      uVar25 = ~uVar8 & uVar2 ^ uVar30;
      uVar2 = uVar27 ^ uVar10 ^ uVar26 ^ uVar31 ^ uVar24;
      uVar13 = ~uVar30 & uVar8 ^ uVar13;
      uVar17 = uVar19 ^ uVar22 ^ uVar40 ^ uVar32 ^ uVar6;
      uVar8 = uVar1 ^ uVar3 ^ uVar12 ^ uVar23 ^ uVar25;
      uVar30 = uVar16 ^ uVar7 ^ uVar18 ^ uVar36 ^ uVar13;
      uVar4 = (uVar17 >> 0x3f | uVar17 << 1) ^ uVar37;
      uVar11 = (uVar37 >> 0x3f | uVar37 << 1) ^ uVar30;
      uVar33 = (uVar30 >> 0x3f | uVar30 << 1) ^ uVar2;
      uVar27 = uVar27 ^ uVar4;
      uVar24 = uVar24 ^ uVar4;
      uVar2 = (uVar2 >> 0x3f | uVar2 << 1) ^ uVar8;
      uVar17 = (uVar8 >> 0x3f | uVar8 << 1) ^ uVar17;
      uVar22 = uVar22 ^ uVar33;
      uVar24 = uVar24 >> 3 | uVar24 << 0x3d;
      uVar6 = uVar6 ^ uVar33;
      uVar13 = uVar13 ^ uVar17;
      uVar37 = uVar22 >> 0x2b | uVar22 << 0x15;
      uVar8 = uVar6 >> 8 | uVar6 << 0x38;
      uVar6 = uVar13 >> 0x32 | uVar13 << 0xe;
      uVar12 = uVar12 ^ uVar11;
      uVar38 = uVar27 >> 0x15 | uVar27 << 0x2b;
      uVar20 = uVar20 ^ uVar2;
      uVar30 = uVar20 >> 0x14 | uVar20 << 0x2c;
      uVar27 = uVar12 ^ 0x8000000080008081 ^ ~uVar30 & uVar38;
      uVar22 = ~uVar38 & uVar37 ^ uVar30;
      uVar38 = ~uVar37 & uVar6 ^ uVar38;
      uVar20 = ~uVar12 & uVar30 ^ uVar6;
      uVar37 = ~uVar6 & uVar12 ^ uVar37;
      uVar25 = uVar25 ^ uVar11;
      uVar30 = uVar25 >> 0x2e | uVar25 << 0x12;
      uVar40 = uVar40 ^ uVar33;
      uVar12 = uVar40 >> 0x24 | uVar40 << 0x1c;
      uVar36 = uVar36 ^ uVar17;
      uVar6 = uVar36 >> 0x2c | uVar36 << 0x14;
      uVar1 = uVar1 ^ uVar11;
      uVar40 = uVar1 >> 0x3d | uVar1 << 3;
      uVar29 = uVar29 ^ uVar2;
      uVar36 = uVar29 >> 0x13 | uVar29 << 0x2d;
      uVar34 = ~uVar24 & uVar12 ^ uVar36;
      uVar29 = ~uVar36 & uVar24 ^ uVar40;
      uVar36 = ~uVar40 & uVar36 ^ uVar6;
      uVar40 = ~uVar6 & uVar40 ^ uVar12;
      uVar24 = ~uVar12 & uVar6 ^ uVar24;
      uVar5 = uVar5 ^ uVar2;
      uVar31 = uVar31 ^ uVar4;
      uVar19 = uVar19 ^ uVar33;
      uVar7 = uVar7 ^ uVar17;
      uVar12 = uVar5 >> 0x3f | uVar5 << 1;
      uVar5 = uVar31 >> 0x3a | uVar31 << 6;
      uVar33 = uVar33 ^ uVar32;
      uVar1 = uVar19 >> 0x27 | uVar19 << 0x19;
      uVar19 = uVar7 >> 0x38 | uVar7 << 8;
      uVar6 = ~uVar30 & uVar12 ^ uVar19;
      uVar7 = ~uVar5 & uVar1 ^ uVar12;
      uVar31 = ~uVar1 & uVar19 ^ uVar5;
      uVar25 = ~uVar12 & uVar5 ^ uVar30;
      uVar1 = ~uVar19 & uVar30 ^ uVar1;
      uVar19 = uVar33 >> 9 | uVar33 << 0x37;
      uVar18 = uVar18 ^ uVar17;
      uVar17 = uVar17 ^ uVar16;
      uVar30 = uVar18 >> 0x25 | uVar18 << 0x1b;
      uVar28 = uVar28 ^ uVar2;
      uVar23 = uVar23 ^ uVar11;
      uVar12 = uVar23 >> 0x1c | uVar23 << 0x24;
      uVar16 = uVar28 >> 0x36 | uVar28 << 10;
      uVar13 = ~uVar12 & uVar16 ^ uVar30;
      uVar10 = uVar10 ^ uVar4;
      uVar4 = uVar4 ^ uVar26;
      uVar10 = uVar10 >> 0x31 | uVar10 << 0xf;
      uVar33 = ~uVar16 & uVar10 ^ uVar12;
      uVar16 = ~uVar10 & uVar8 ^ uVar16;
      uVar10 = ~uVar8 & uVar30 ^ uVar10;
      uVar5 = uVar4 >> 2 | uVar4 << 0x3e;
      uVar8 = ~uVar30 & uVar12 ^ uVar8;
      uVar30 = uVar17 >> 0x19 | uVar17 << 0x27;
      uVar11 = uVar11 ^ uVar3;
      uVar2 = uVar2 ^ uVar14;
      uVar3 = uVar11 >> 0x17 | uVar11 << 0x29;
      uVar11 = uVar2 >> 0x3e | uVar2 << 2;
      uVar2 = ~uVar11 & uVar5 ^ uVar3;
      uVar17 = uVar6 ^ uVar10 ^ uVar37 ^ uVar34 ^ uVar2;
      uVar12 = ~uVar3 & uVar11 ^ uVar30;
      uVar18 = ~uVar30 & uVar3 ^ uVar19;
      uVar3 = ~uVar19 & uVar30 ^ uVar5;
      uVar30 = uVar31 ^ uVar33 ^ uVar22 ^ uVar36 ^ uVar18;
      uVar21 = uVar1 ^ uVar16 ^ uVar38 ^ uVar29 ^ uVar12;
      uVar11 = ~uVar5 & uVar19 ^ uVar11;
      uVar26 = uVar7 ^ uVar13 ^ uVar27 ^ uVar40 ^ uVar3;
      uVar32 = (uVar17 >> 0x3f | uVar17 << 1) ^ uVar30;
      uVar5 = uVar25 ^ uVar8 ^ uVar20 ^ uVar24 ^ uVar11;
      uVar1 = uVar1 ^ uVar32;
      uVar12 = uVar12 ^ uVar32;
      uVar30 = (uVar30 >> 0x3f | uVar30 << 1) ^ uVar5;
      uVar17 = (uVar26 >> 0x3f | uVar26 << 1) ^ uVar17;
      uVar23 = uVar1 >> 0x15 | uVar1 << 0x2b;
      uVar1 = uVar12 >> 3 | uVar12 << 0x3d;
      uVar26 = (uVar21 >> 0x3f | uVar21 << 1) ^ uVar26;
      uVar21 = (uVar5 >> 0x3f | uVar5 << 1) ^ uVar21;
      uVar11 = uVar11 ^ uVar17;
      uVar3 = uVar3 ^ uVar30;
      uVar10 = uVar10 ^ uVar21;
      uVar19 = uVar11 >> 0x32 | uVar11 << 0xe;
      uVar33 = uVar33 ^ uVar26;
      uVar3 = uVar3 >> 0x2e | uVar3 << 0x12;
      uVar27 = uVar27 ^ uVar30;
      uVar11 = uVar33 >> 0x13 | uVar33 << 0x2d;
      uVar36 = uVar36 ^ uVar26;
      uVar5 = uVar36 >> 0x14 | uVar36 << 0x2c;
      uVar14 = uVar27 ^ 0x8000000000008009 ^ ~uVar5 & uVar23;
      uVar12 = uVar10 >> 0x2b | uVar10 << 0x15;
      uVar36 = ~uVar19 & uVar27 ^ uVar12;
      uVar33 = ~uVar12 & uVar19 ^ uVar23;
      uVar12 = ~uVar23 & uVar12 ^ uVar5;
      uVar19 = ~uVar27 & uVar5 ^ uVar19;
      uVar24 = uVar24 ^ uVar17;
      uVar37 = uVar37 ^ uVar21;
      uVar23 = uVar24 >> 0x2c | uVar24 << 0x14;
      uVar7 = uVar7 ^ uVar30;
      uVar5 = uVar37 >> 0x24 | uVar37 << 0x1c;
      uVar24 = uVar7 >> 0x3d | uVar7 << 3;
      uVar27 = ~uVar1 & uVar5 ^ uVar11;
      uVar7 = ~uVar24 & uVar11 ^ uVar23;
      uVar11 = ~uVar11 & uVar1 ^ uVar24;
      uVar10 = ~uVar23 & uVar24 ^ uVar5;
      uVar1 = ~uVar5 & uVar23 ^ uVar1;
      uVar8 = uVar8 ^ uVar17;
      uVar22 = uVar22 ^ uVar26;
      uVar24 = uVar8 >> 0x38 | uVar8 << 8;
      uVar29 = uVar29 ^ uVar32;
      uVar5 = uVar22 >> 0x3f | uVar22 << 1;
      uVar8 = uVar29 >> 0x3a | uVar29 << 6;
      uVar4 = ~uVar3 & uVar5 ^ uVar24;
      uVar28 = ~uVar5 & uVar8 ^ uVar3;
      uVar6 = uVar6 ^ uVar21;
      uVar29 = uVar6 >> 0x27 | uVar6 << 0x19;
      uVar23 = ~uVar24 & uVar3 ^ uVar29;
      uVar5 = ~uVar8 & uVar29 ^ uVar5;
      uVar8 = ~uVar29 & uVar24 ^ uVar8;
      uVar20 = uVar20 ^ uVar17;
      uVar17 = uVar17 ^ uVar25;
      uVar22 = uVar20 >> 0x25 | uVar20 << 0x1b;
      uVar40 = uVar40 ^ uVar30;
      uVar40 = uVar40 >> 0x1c | uVar40 << 0x24;
      uVar31 = uVar31 ^ uVar26;
      uVar37 = uVar31 >> 0x36 | uVar31 << 10;
      uVar3 = ~uVar40 & uVar37 ^ uVar22;
      uVar16 = uVar16 ^ uVar32;
      uVar29 = uVar16 >> 0x31 | uVar16 << 0xf;
      uVar24 = ~uVar37 & uVar29 ^ uVar40;
      uVar30 = uVar30 ^ uVar13;
      uVar2 = uVar2 ^ uVar21;
      uVar21 = uVar21 ^ uVar34;
      uVar20 = uVar30 >> 0x17 | uVar30 << 0x29;
      uVar16 = uVar2 >> 8 | uVar2 << 0x38;
      uVar31 = ~uVar22 & uVar40 ^ uVar16;
      uVar37 = ~uVar29 & uVar16 ^ uVar37;
      uVar29 = ~uVar16 & uVar22 ^ uVar29;
      uVar26 = uVar26 ^ uVar18;
      uVar30 = uVar26 >> 0x3e | uVar26 << 2;
      uVar32 = uVar32 ^ uVar38;
      uVar18 = uVar21 >> 9 | uVar21 << 0x37;
      uVar26 = uVar32 >> 2 | uVar32 << 0x3e;
      uVar16 = uVar17 >> 0x19 | uVar17 << 0x27;
      uVar32 = ~uVar20 & uVar30 ^ uVar16;
      uVar6 = ~uVar30 & uVar26 ^ uVar20;
      uVar21 = uVar23 ^ uVar37 ^ uVar33 ^ uVar11 ^ uVar32;
      uVar22 = uVar4 ^ uVar29 ^ uVar36 ^ uVar27 ^ uVar6;
      uVar30 = ~uVar26 & uVar18 ^ uVar30;
      uVar26 = ~uVar18 & uVar16 ^ uVar26;
      uVar18 = ~uVar16 & uVar20 ^ uVar18;
      uVar16 = uVar28 ^ uVar31 ^ uVar19 ^ uVar1 ^ uVar30;
      uVar40 = uVar5 ^ uVar3 ^ uVar14 ^ uVar10 ^ uVar26;
      uVar2 = uVar8 ^ uVar24 ^ uVar12 ^ uVar7 ^ uVar18;
      uVar25 = (uVar22 >> 0x3f | uVar22 << 1) ^ uVar2;
      uVar34 = (uVar21 >> 0x3f | uVar21 << 1) ^ uVar40;
      uVar21 = (uVar16 >> 0x3f | uVar16 << 1) ^ uVar21;
      uVar16 = (uVar2 >> 0x3f | uVar2 << 1) ^ uVar16;
      uVar23 = uVar23 ^ uVar25;
      uVar32 = uVar32 ^ uVar25;
      uVar22 = (uVar40 >> 0x3f | uVar40 << 1) ^ uVar22;
      uVar29 = uVar29 ^ uVar21;
      uVar40 = uVar23 >> 0x15 | uVar23 << 0x2b;
      uVar26 = uVar26 ^ uVar16;
      uVar30 = uVar30 ^ uVar22;
      uVar2 = uVar29 >> 0x2b | uVar29 << 0x15;
      uVar14 = uVar14 ^ uVar16;
      uVar30 = uVar30 >> 0x32 | uVar30 << 0xe;
      uVar20 = ~uVar30 & uVar14 ^ uVar2;
      uVar7 = uVar7 ^ uVar34;
      uVar29 = uVar7 >> 0x14 | uVar7 << 0x2c;
      uVar23 = ~uVar2 & uVar30 ^ uVar40;
      uVar17 = ~uVar40 & uVar2 ^ uVar29;
      uVar2 = uVar32 >> 3 | uVar32 << 0x3d;
      uVar30 = ~uVar14 & uVar29 ^ uVar30;
      uVar1 = uVar1 ^ uVar22;
      uVar24 = uVar24 ^ uVar34;
      uVar1 = uVar1 >> 0x2c | uVar1 << 0x14;
      uVar36 = uVar36 ^ uVar21;
      uVar5 = uVar5 ^ uVar16;
      uVar24 = uVar24 >> 0x13 | uVar24 << 0x2d;
      uVar7 = uVar36 >> 0x24 | uVar36 << 0x1c;
      uVar36 = uVar5 >> 0x3d | uVar5 << 3;
      uVar5 = ~uVar24 & uVar2 ^ uVar36;
      uVar38 = ~uVar2 & uVar7 ^ uVar24;
      uVar32 = ~uVar1 & uVar36 ^ uVar7;
      uVar24 = ~uVar36 & uVar24 ^ uVar1;
      uVar2 = ~uVar7 & uVar1 ^ uVar2;
      uVar36 = uVar26 >> 0x2e | uVar26 << 0x12;
      uVar31 = uVar31 ^ uVar22;
      uVar11 = uVar11 ^ uVar25;
      uVar4 = uVar4 ^ uVar21;
      uVar26 = uVar31 >> 0x38 | uVar31 << 8;
      uVar1 = uVar11 >> 0x3a | uVar11 << 6;
      uVar12 = uVar12 ^ uVar34;
      uVar11 = uVar4 >> 0x27 | uVar4 << 0x19;
      uVar4 = ~uVar26 & uVar36 ^ uVar11;
      uVar7 = uVar12 >> 0x3f | uVar12 << 1;
      uVar31 = ~uVar1 & uVar11 ^ uVar7;
      uVar13 = ~uVar11 & uVar26 ^ uVar1;
      uVar26 = ~uVar36 & uVar7 ^ uVar26;
      uVar36 = ~uVar7 & uVar1 ^ uVar36;
      uVar10 = uVar10 ^ uVar16;
      uVar8 = uVar8 ^ uVar34;
      uVar7 = uVar10 >> 0x1c | uVar10 << 0x24;
      uVar34 = uVar34 ^ uVar18;
      uVar12 = uVar8 >> 0x36 | uVar8 << 10;
      uVar16 = uVar16 ^ uVar3;
      uVar18 = uVar34 >> 0x3e | uVar34 << 2;
      uVar37 = uVar37 ^ uVar25;
      uVar25 = uVar25 ^ uVar33;
      uVar8 = uVar37 >> 0x31 | uVar37 << 0xf;
      uVar11 = ~uVar12 & uVar8 ^ uVar7;
      uVar6 = uVar6 ^ uVar21;
      uVar21 = uVar21 ^ uVar27;
      uVar33 = uVar6 >> 8 | uVar6 << 0x38;
      uVar10 = ~uVar8 & uVar33 ^ uVar12;
      uVar1 = uVar21 >> 9 | uVar21 << 0x37;
      uVar19 = uVar19 ^ uVar22;
      uVar22 = uVar22 ^ uVar28;
      uVar3 = uVar19 >> 0x25 | uVar19 << 0x1b;
      uVar27 = ~uVar7 & uVar12 ^ uVar3;
      uVar8 = ~uVar33 & uVar3 ^ uVar8;
      uVar12 = uVar22 >> 0x19 | uVar22 << 0x27;
      uVar35 = ~uVar29 & uVar40 ^ uVar14 ^ 0x8a;
      uVar33 = ~uVar3 & uVar7 ^ uVar33;
      uVar3 = uVar16 >> 0x17 | uVar16 << 0x29;
      uVar40 = ~uVar3 & uVar18 ^ uVar12;
      uVar34 = uVar4 ^ uVar10 ^ uVar23 ^ uVar5 ^ uVar40;
      uVar29 = uVar25 >> 2 | uVar25 << 0x3e;
      uVar6 = ~uVar1 & uVar12 ^ uVar29;
      uVar14 = ~uVar18 & uVar29 ^ uVar3;
      uVar22 = uVar26 ^ uVar8 ^ uVar20 ^ uVar38 ^ uVar14;
      uVar7 = uVar27 ^ uVar6 ^ uVar32 ^ uVar31 ^ uVar35;
      uVar3 = ~uVar12 & uVar3 ^ uVar1;
      uVar18 = ~uVar29 & uVar1 ^ uVar18;
      uVar12 = uVar13 ^ uVar11 ^ uVar17 ^ uVar24 ^ uVar3;
      uVar29 = (uVar22 >> 0x3f | uVar22 << 1) ^ uVar12;
      uVar28 = (uVar34 >> 0x3f | uVar34 << 1) ^ uVar7;
      uVar16 = uVar36 ^ uVar33 ^ uVar30 ^ uVar2 ^ uVar18;
      uVar22 = (uVar7 >> 0x3f | uVar7 << 1) ^ uVar22;
      uVar21 = (uVar12 >> 0x3f | uVar12 << 1) ^ uVar16;
      uVar40 = uVar40 ^ uVar29;
      uVar34 = (uVar16 >> 0x3f | uVar16 << 1) ^ uVar34;
      uVar18 = uVar18 ^ uVar22;
      uVar35 = uVar35 ^ uVar21;
      uVar12 = uVar40 >> 3 | uVar40 << 0x3d;
      uVar8 = uVar8 ^ uVar34;
      uVar7 = uVar8 >> 0x2b | uVar8 << 0x15;
      uVar18 = uVar18 >> 0x32 | uVar18 << 0xe;
      uVar4 = uVar4 ^ uVar29;
      uVar8 = uVar4 >> 0x15 | uVar4 << 0x2b;
      uVar19 = ~uVar18 & uVar35 ^ uVar7;
      uVar24 = uVar24 ^ uVar28;
      uVar16 = uVar24 >> 0x14 | uVar24 << 0x2c;
      uVar4 = ~uVar7 & uVar18 ^ uVar8;
      uVar1 = ~uVar8 & uVar7 ^ uVar16;
      uVar18 = ~uVar35 & uVar16 ^ uVar18;
      uVar11 = uVar11 ^ uVar28;
      uVar40 = uVar11 >> 0x13 | uVar11 << 0x2d;
      uVar20 = uVar20 ^ uVar34;
      uVar7 = uVar20 >> 0x24 | uVar20 << 0x1c;
      uVar2 = uVar2 ^ uVar22;
      uVar2 = uVar2 >> 0x2c | uVar2 << 0x14;
      uVar25 = ~uVar12 & uVar7 ^ uVar40;
      uVar31 = uVar31 ^ uVar21;
      uVar24 = uVar31 >> 0x3d | uVar31 << 3;
      uVar11 = ~uVar40 & uVar12 ^ uVar24;
      uVar37 = ~uVar2 & uVar24 ^ uVar7;
      uVar40 = ~uVar24 & uVar40 ^ uVar2;
      uVar12 = ~uVar7 & uVar2 ^ uVar12;
      uVar33 = uVar33 ^ uVar22;
      uVar17 = uVar17 ^ uVar28;
      uVar31 = uVar33 >> 0x38 | uVar33 << 8;
      uVar7 = uVar17 >> 0x3f | uVar17 << 1;
      uVar6 = uVar6 ^ uVar21;
      uVar26 = uVar26 ^ uVar34;
      uVar2 = uVar6 >> 0x2e | uVar6 << 0x12;
      uVar17 = uVar26 >> 0x27 | uVar26 << 0x19;
      uVar20 = ~uVar2 & uVar7 ^ uVar31;
      uVar6 = ~uVar31 & uVar2 ^ uVar17;
      uVar5 = uVar5 ^ uVar29;
      uVar24 = uVar5 >> 0x3a | uVar5 << 6;
      uVar31 = ~uVar17 & uVar31 ^ uVar24;
      uVar17 = ~uVar24 & uVar17 ^ uVar7;
      uVar2 = ~uVar7 & uVar24 ^ uVar2;
      uVar10 = uVar10 ^ uVar29;
      uVar10 = uVar10 >> 0x31 | uVar10 << 0xf;
      uVar32 = uVar32 ^ uVar21;
      uVar3 = uVar28 ^ uVar3;
      uVar13 = uVar13 ^ uVar28;
      uVar24 = uVar32 >> 0x1c | uVar32 << 0x24;
      uVar26 = uVar13 >> 0x36 | uVar13 << 10;
      uVar5 = ~uVar26 & uVar10 ^ uVar24;
      uVar14 = uVar14 ^ uVar34;
      uVar34 = uVar34 ^ uVar38;
      uVar14 = uVar14 >> 8 | uVar14 << 0x38;
      uVar13 = ~uVar10 & uVar14 ^ uVar26;
      uVar30 = uVar30 ^ uVar22;
      uVar22 = uVar22 ^ uVar36;
      uVar7 = uVar30 >> 0x25 | uVar30 << 0x1b;
      uVar10 = ~uVar14 & uVar7 ^ uVar10;
      uVar14 = ~uVar7 & uVar24 ^ uVar14;
      uVar21 = uVar21 ^ uVar27;
      uVar29 = uVar29 ^ uVar23;
      uVar30 = uVar3 >> 0x3e | uVar3 << 2;
      uVar7 = ~uVar24 & uVar26 ^ uVar7;
      uVar27 = uVar21 >> 0x17 | uVar21 << 0x29;
      uVar3 = uVar29 >> 2 | uVar29 << 0x3e;
      uVar36 = uVar34 >> 9 | uVar34 << 0x37;
      uVar29 = uVar22 >> 0x19 | uVar22 << 0x27;
      uVar23 = ~uVar36 & uVar29 ^ uVar3;
      uVar33 = ~uVar29 & uVar27 ^ uVar36;
      uVar24 = uVar31 ^ uVar5 ^ uVar1 ^ uVar40 ^ uVar33;
      uVar29 = ~uVar27 & uVar30 ^ uVar29;
      uVar27 = ~uVar30 & uVar3 ^ uVar27;
      uVar30 = ~uVar3 & uVar36 ^ uVar30;
      uVar16 = ~uVar16 & uVar8 ^ uVar35 ^ 0x88;
      uVar8 = uVar6 ^ uVar13 ^ uVar4 ^ uVar11 ^ uVar29;
      uVar34 = uVar20 ^ uVar10 ^ uVar19 ^ uVar25 ^ uVar27;
      uVar3 = uVar2 ^ uVar14 ^ uVar18 ^ uVar12 ^ uVar30;
      uVar38 = (uVar24 >> 0x3f | uVar24 << 1) ^ uVar3;
      uVar24 = (uVar34 >> 0x3f | uVar34 << 1) ^ uVar24;
      uVar35 = (uVar3 >> 0x3f | uVar3 << 1) ^ uVar8;
      uVar36 = uVar16 ^ uVar38;
      uVar3 = uVar7 ^ uVar23 ^ uVar37 ^ uVar17 ^ uVar16;
      uVar10 = uVar10 ^ uVar35;
      uVar29 = uVar29 ^ uVar24;
      uVar39 = (uVar8 >> 0x3f | uVar8 << 1) ^ uVar3;
      uVar16 = uVar29 >> 3 | uVar29 << 0x3d;
      uVar34 = (uVar3 >> 0x3f | uVar3 << 1) ^ uVar34;
      uVar6 = uVar6 ^ uVar24;
      uVar30 = uVar30 ^ uVar34;
      uVar40 = uVar40 ^ uVar39;
      uVar3 = uVar6 >> 0x15 | uVar6 << 0x2b;
      uVar8 = uVar30 >> 0x32 | uVar30 << 0xe;
      uVar29 = uVar40 >> 0x14 | uVar40 << 0x2c;
      uVar26 = uVar36 ^ 0x80008009 ^ ~uVar29 & uVar3;
      uVar30 = uVar10 >> 0x2b | uVar10 << 0x15;
      uVar21 = ~uVar30 & uVar8 ^ uVar3;
      uVar22 = ~uVar8 & uVar36 ^ uVar30;
      uVar3 = ~uVar3 & uVar30 ^ uVar29;
      uVar8 = ~uVar36 & uVar29 ^ uVar8;
      uVar19 = uVar19 ^ uVar35;
      uVar29 = uVar19 >> 0x24 | uVar19 << 0x1c;
      uVar5 = uVar5 ^ uVar39;
      uVar40 = uVar5 >> 0x13 | uVar5 << 0x2d;
      uVar12 = uVar12 ^ uVar34;
      uVar32 = ~uVar16 & uVar29 ^ uVar40;
      uVar30 = uVar12 >> 0x2c | uVar12 << 0x14;
      uVar17 = uVar17 ^ uVar38;
      uVar36 = uVar17 >> 0x3d | uVar17 << 3;
      uVar10 = ~uVar40 & uVar16 ^ uVar36;
      uVar12 = ~uVar36 & uVar40 ^ uVar30;
      uVar5 = ~uVar30 & uVar36 ^ uVar29;
      uVar16 = ~uVar29 & uVar30 ^ uVar16;
      uVar1 = uVar1 ^ uVar39;
      uVar14 = uVar14 ^ uVar34;
      uVar29 = uVar1 >> 0x3f | uVar1 << 1;
      uVar20 = uVar20 ^ uVar35;
      uVar23 = uVar23 ^ uVar38;
      uVar1 = uVar14 >> 0x38 | uVar14 << 8;
      uVar30 = uVar23 >> 0x2e | uVar23 << 0x12;
      uVar40 = uVar20 >> 0x27 | uVar20 << 0x19;
      uVar23 = ~uVar30 & uVar29 ^ uVar1;
      uVar19 = ~uVar1 & uVar30 ^ uVar40;
      uVar11 = uVar11 ^ uVar24;
      uVar36 = uVar11 >> 0x3a | uVar11 << 6;
      uVar28 = ~uVar40 & uVar1 ^ uVar36;
      uVar11 = ~uVar36 & uVar40 ^ uVar29;
      uVar30 = ~uVar29 & uVar36 ^ uVar30;
      uVar37 = uVar37 ^ uVar38;
      uVar38 = uVar38 ^ uVar7;
      uVar37 = uVar37 >> 0x1c | uVar37 << 0x24;
      uVar31 = uVar31 ^ uVar39;
      uVar39 = uVar39 ^ uVar33;
      uVar40 = uVar31 >> 0x36 | uVar31 << 10;
      uVar18 = uVar18 ^ uVar34;
      uVar13 = uVar13 ^ uVar24;
      uVar24 = uVar24 ^ uVar4;
      uVar34 = uVar34 ^ uVar2;
      uVar2 = uVar18 >> 0x25 | uVar18 << 0x1b;
      uVar1 = uVar13 >> 0x31 | uVar13 << 0xf;
      uVar29 = ~uVar37 & uVar40 ^ uVar2;
      uVar13 = uVar39 >> 0x3e | uVar39 << 2;
      uVar7 = ~uVar40 & uVar1 ^ uVar37;
      uVar27 = uVar27 ^ uVar35;
      uVar35 = uVar35 ^ uVar25;
      uVar36 = uVar27 >> 8 | uVar27 << 0x38;
      uVar40 = ~uVar1 & uVar36 ^ uVar40;
      uVar1 = ~uVar36 & uVar2 ^ uVar1;
      uVar17 = uVar24 >> 2 | uVar24 << 0x3e;
      uVar36 = ~uVar2 & uVar37 ^ uVar36;
      uVar24 = uVar34 >> 0x19 | uVar34 << 0x27;
      uVar18 = uVar38 >> 0x17 | uVar38 << 0x29;
      uVar2 = uVar35 >> 9 | uVar35 << 0x37;
      uVar38 = ~uVar13 & uVar17 ^ uVar18;
      uVar20 = ~uVar24 & uVar18 ^ uVar2;
      uVar37 = ~uVar18 & uVar13 ^ uVar24;
      uVar18 = uVar23 ^ uVar1 ^ uVar22 ^ uVar32 ^ uVar38;
      uVar4 = uVar28 ^ uVar7 ^ uVar3 ^ uVar12 ^ uVar20;
      uVar13 = ~uVar17 & uVar2 ^ uVar13;
      uVar17 = ~uVar2 & uVar24 ^ uVar17;
      uVar2 = uVar30 ^ uVar36 ^ uVar8 ^ uVar16 ^ uVar13;
      uVar24 = uVar19 ^ uVar40 ^ uVar21 ^ uVar10 ^ uVar37;
      uVar31 = (uVar18 >> 0x3f | uVar18 << 1) ^ uVar4;
      uVar6 = uVar11 ^ uVar29 ^ uVar26 ^ uVar5 ^ uVar17;
      uVar14 = (uVar4 >> 0x3f | uVar4 << 1) ^ uVar2;
      uVar35 = (uVar2 >> 0x3f | uVar2 << 1) ^ uVar24;
      uVar19 = uVar19 ^ uVar31;
      uVar37 = uVar37 ^ uVar31;
      uVar18 = (uVar6 >> 0x3f | uVar6 << 1) ^ uVar18;
      uVar1 = uVar1 ^ uVar35;
      uVar6 = (uVar24 >> 0x3f | uVar24 << 1) ^ uVar6;
      uVar26 = uVar26 ^ uVar14;
      uVar13 = uVar13 ^ uVar18;
      uVar1 = uVar1 >> 0x2b | uVar1 << 0x15;
      uVar12 = uVar12 ^ uVar6;
      uVar2 = uVar12 >> 0x14 | uVar12 << 0x2c;
      uVar24 = uVar19 >> 0x15 | uVar19 << 0x2b;
      uVar33 = uVar26 ^ 0x8000000a ^ ~uVar2 & uVar24;
      uVar12 = uVar13 >> 0x32 | uVar13 << 0xe;
      uVar19 = ~uVar1 & uVar12 ^ uVar24;
      uVar4 = ~uVar12 & uVar26 ^ uVar1;
      uVar1 = ~uVar24 & uVar1 ^ uVar2;
      uVar24 = uVar37 >> 3 | uVar37 << 0x3d;
      uVar12 = ~uVar26 & uVar2 ^ uVar12;
      uVar17 = uVar17 ^ uVar14;
      uVar7 = uVar7 ^ uVar6;
      uVar26 = uVar17 >> 0x2e | uVar17 << 0x12;
      uVar22 = uVar22 ^ uVar35;
      uVar17 = uVar7 >> 0x13 | uVar7 << 0x2d;
      uVar7 = uVar22 >> 0x24 | uVar22 << 0x1c;
      uVar16 = uVar16 ^ uVar18;
      uVar34 = ~uVar24 & uVar7 ^ uVar17;
      uVar16 = uVar16 >> 0x2c | uVar16 << 0x14;
      uVar11 = uVar11 ^ uVar14;
      uVar2 = uVar11 >> 0x3d | uVar11 << 3;
      uVar11 = ~uVar17 & uVar24 ^ uVar2;
      uVar27 = ~uVar2 & uVar17 ^ uVar16;
      uVar17 = ~uVar16 & uVar2 ^ uVar7;
      uVar24 = ~uVar7 & uVar16 ^ uVar24;
      uVar3 = uVar3 ^ uVar6;
      uVar36 = uVar36 ^ uVar18;
      uVar3 = uVar3 >> 0x3f | uVar3 << 1;
      uVar23 = uVar23 ^ uVar35;
      uVar36 = uVar36 >> 0x38 | uVar36 << 8;
      uVar7 = uVar23 >> 0x27 | uVar23 << 0x19;
      uVar37 = ~uVar26 & uVar3 ^ uVar36;
      uVar22 = ~uVar36 & uVar26 ^ uVar7;
      uVar10 = uVar10 ^ uVar31;
      uVar16 = uVar10 >> 0x3a | uVar10 << 6;
      uVar25 = ~uVar7 & uVar36 ^ uVar16;
      uVar23 = ~uVar16 & uVar7 ^ uVar3;
      uVar26 = ~uVar3 & uVar16 ^ uVar26;
      uVar28 = uVar28 ^ uVar6;
      uVar6 = uVar6 ^ uVar20;
      uVar10 = uVar28 >> 0x36 | uVar28 << 10;
      uVar5 = uVar5 ^ uVar14;
      uVar8 = uVar8 ^ uVar18;
      uVar2 = uVar5 >> 0x1c | uVar5 << 0x24;
      uVar18 = uVar18 ^ uVar30;
      uVar16 = uVar8 >> 0x25 | uVar8 << 0x1b;
      uVar30 = ~uVar2 & uVar10 ^ uVar16;
      uVar40 = uVar40 ^ uVar31;
      uVar38 = uVar38 ^ uVar35;
      uVar31 = uVar31 ^ uVar21;
      uVar35 = uVar35 ^ uVar32;
      uVar3 = uVar40 >> 0x31 | uVar40 << 0xf;
      uVar40 = uVar38 >> 8 | uVar38 << 0x38;
      uVar36 = uVar18 >> 0x19 | uVar18 << 0x27;
      uVar7 = ~uVar10 & uVar3 ^ uVar2;
      uVar10 = ~uVar3 & uVar40 ^ uVar10;
      uVar2 = ~uVar16 & uVar2 ^ uVar40;
      uVar8 = uVar6 >> 0x3e | uVar6 << 2;
      uVar14 = uVar14 ^ uVar29;
      uVar3 = ~uVar40 & uVar16 ^ uVar3;
      uVar18 = uVar31 >> 2 | uVar31 << 0x3e;
      uVar16 = uVar14 >> 0x17 | uVar14 << 0x29;
      uVar40 = ~uVar8 & uVar18 ^ uVar16;
      uVar29 = uVar35 >> 9 | uVar35 << 0x37;
      uVar38 = ~uVar36 & uVar16 ^ uVar29;
      uVar28 = uVar37 ^ uVar3 ^ uVar4 ^ uVar34 ^ uVar40;
      uVar6 = ~uVar16 & uVar8 ^ uVar36;
      uVar16 = ~uVar29 & uVar36 ^ uVar18;
      uVar36 = uVar25 ^ uVar7 ^ uVar1 ^ uVar27 ^ uVar38;
      uVar21 = uVar22 ^ uVar10 ^ uVar19 ^ uVar11 ^ uVar6;
      uVar8 = ~uVar18 & uVar29 ^ uVar8;
      uVar5 = uVar23 ^ uVar30 ^ uVar33 ^ uVar17 ^ uVar16;
      uVar29 = uVar26 ^ uVar2 ^ uVar12 ^ uVar24 ^ uVar8;
      uVar20 = (uVar28 >> 0x3f | uVar28 << 1) ^ uVar36;
      uVar35 = (uVar21 >> 0x3f | uVar21 << 1) ^ uVar5;
      uVar18 = (uVar36 >> 0x3f | uVar36 << 1) ^ uVar29;
      uVar6 = uVar6 ^ uVar20;
      uVar28 = (uVar5 >> 0x3f | uVar5 << 1) ^ uVar28;
      uVar21 = (uVar29 >> 0x3f | uVar29 << 1) ^ uVar21;
      uVar16 = uVar16 ^ uVar18;
      uVar3 = uVar3 ^ uVar21;
      uVar8 = uVar8 ^ uVar28;
      uVar16 = uVar16 >> 0x2e | uVar16 << 0x12;
      uVar36 = uVar3 >> 0x2b | uVar3 << 0x15;
      uVar8 = uVar8 >> 0x32 | uVar8 << 0xe;
      uVar27 = uVar27 ^ uVar35;
      uVar22 = uVar22 ^ uVar20;
      uVar33 = uVar33 ^ uVar18;
      uVar3 = uVar27 >> 0x14 | uVar27 << 0x2c;
      uVar29 = uVar22 >> 0x15 | uVar22 << 0x2b;
      uVar27 = uVar33 ^ 0x8000808b ^ ~uVar3 & uVar29;
      uVar14 = ~uVar36 & uVar8 ^ uVar29;
      uVar5 = ~uVar29 & uVar36 ^ uVar3;
      uVar36 = ~uVar8 & uVar33 ^ uVar36;
      uVar29 = uVar6 >> 3 | uVar6 << 0x3d;
      uVar8 = ~uVar33 & uVar3 ^ uVar8;
      uVar4 = uVar4 ^ uVar21;
      uVar7 = uVar7 ^ uVar35;
      uVar3 = uVar4 >> 0x24 | uVar4 << 0x1c;
      uVar24 = uVar24 ^ uVar28;
      uVar4 = uVar7 >> 0x13 | uVar7 << 0x2d;
      uVar7 = uVar24 >> 0x2c | uVar24 << 0x14;
      uVar13 = ~uVar29 & uVar3 ^ uVar4;
      uVar23 = uVar23 ^ uVar18;
      uVar24 = uVar23 >> 0x3d | uVar23 << 3;
      uVar22 = ~uVar4 & uVar29 ^ uVar24;
      uVar32 = ~uVar24 & uVar4 ^ uVar7;
      uVar23 = ~uVar7 & uVar24 ^ uVar3;
      uVar29 = ~uVar3 & uVar7 ^ uVar29;
      uVar1 = uVar1 ^ uVar35;
      uVar2 = uVar2 ^ uVar28;
      uVar3 = uVar1 >> 0x3f | uVar1 << 1;
      uVar37 = uVar37 ^ uVar21;
      uVar24 = uVar2 >> 0x38 | uVar2 << 8;
      uVar2 = uVar37 >> 0x27 | uVar37 << 0x19;
      uVar6 = ~uVar16 & uVar3 ^ uVar24;
      uVar33 = ~uVar24 & uVar16 ^ uVar2;
      uVar11 = uVar11 ^ uVar20;
      uVar7 = uVar11 >> 0x3a | uVar11 << 6;
      uVar12 = uVar12 ^ uVar28;
      uVar31 = ~uVar2 & uVar24 ^ uVar7;
      uVar28 = uVar28 ^ uVar26;
      uVar37 = ~uVar7 & uVar2 ^ uVar3;
      uVar16 = ~uVar3 & uVar7 ^ uVar16;
      uVar1 = uVar12 >> 0x25 | uVar12 << 0x1b;
      uVar17 = uVar17 ^ uVar18;
      uVar2 = uVar17 >> 0x1c | uVar17 << 0x24;
      uVar25 = uVar25 ^ uVar35;
      uVar35 = uVar35 ^ uVar38;
      uVar17 = uVar25 >> 0x36 | uVar25 << 10;
      uVar10 = uVar10 ^ uVar20;
      uVar20 = uVar20 ^ uVar19;
      uVar3 = ~uVar2 & uVar17 ^ uVar1;
      uVar7 = uVar10 >> 0x31 | uVar10 << 0xf;
      uVar19 = uVar35 >> 0x3e | uVar35 << 2;
      uVar24 = ~uVar17 & uVar7 ^ uVar2;
      uVar12 = uVar20 >> 2 | uVar20 << 0x3e;
      uVar40 = uVar40 ^ uVar21;
      uVar21 = uVar21 ^ uVar34;
      uVar40 = uVar40 >> 8 | uVar40 << 0x38;
      uVar17 = ~uVar7 & uVar40 ^ uVar17;
      uVar7 = ~uVar40 & uVar1 ^ uVar7;
      uVar40 = ~uVar1 & uVar2 ^ uVar40;
      uVar10 = uVar21 >> 9 | uVar21 << 0x37;
      uVar18 = uVar18 ^ uVar30;
      uVar11 = uVar28 >> 0x19 | uVar28 << 0x27;
      uVar2 = uVar18 >> 0x17 | uVar18 << 0x29;
      uVar28 = ~uVar19 & uVar12 ^ uVar2;
      uVar30 = ~uVar12 & uVar10 ^ uVar19;
      uVar4 = uVar6 ^ uVar7 ^ uVar36 ^ uVar13 ^ uVar28;
      uVar18 = uVar16 ^ uVar40 ^ uVar8 ^ uVar29 ^ uVar30;
      uVar1 = ~uVar2 & uVar19 ^ uVar11;
      uVar38 = ~uVar11 & uVar2 ^ uVar10;
      uVar12 = ~uVar10 & uVar11 ^ uVar12;
      uVar10 = uVar31 ^ uVar24 ^ uVar5 ^ uVar32 ^ uVar38;
      uVar11 = uVar33 ^ uVar17 ^ uVar14 ^ uVar22 ^ uVar1;
      uVar34 = (uVar4 >> 0x3f | uVar4 << 1) ^ uVar10;
      uVar2 = uVar37 ^ uVar3 ^ uVar27 ^ uVar23 ^ uVar12;
      uVar21 = (uVar18 >> 0x3f | uVar18 << 1) ^ uVar11;
      uVar35 = (uVar11 >> 0x3f | uVar11 << 1) ^ uVar2;
      uVar18 = (uVar10 >> 0x3f | uVar10 << 1) ^ uVar18;
      uVar33 = uVar33 ^ uVar34;
      uVar1 = uVar1 ^ uVar34;
      uVar4 = (uVar2 >> 0x3f | uVar2 << 1) ^ uVar4;
      uVar11 = uVar33 >> 0x15 | uVar33 << 0x2b;
      uVar7 = uVar7 ^ uVar21;
      uVar2 = uVar1 >> 3 | uVar1 << 0x3d;
      uVar12 = uVar12 ^ uVar18;
      uVar27 = uVar27 ^ uVar18;
      uVar30 = uVar30 ^ uVar4;
      uVar12 = uVar12 >> 0x2e | uVar12 << 0x12;
      uVar30 = uVar30 >> 0x32 | uVar30 << 0xe;
      uVar32 = uVar32 ^ uVar35;
      uVar1 = uVar32 >> 0x14 | uVar32 << 0x2c;
      uVar25 = uVar27 ^ 0x800000000000008b ^ ~uVar1 & uVar11;
      uVar7 = uVar7 >> 0x2b | uVar7 << 0x15;
      uVar19 = ~uVar30 & uVar27 ^ uVar7;
      uVar33 = ~uVar7 & uVar30 ^ uVar11;
      uVar11 = ~uVar11 & uVar7 ^ uVar1;
      uVar30 = ~uVar27 & uVar1 ^ uVar30;
      uVar24 = uVar24 ^ uVar35;
      uVar29 = uVar29 ^ uVar4;
      uVar36 = uVar36 ^ uVar21;
      uVar24 = uVar24 >> 0x13 | uVar24 << 0x2d;
      uVar7 = uVar29 >> 0x2c | uVar29 << 0x14;
      uVar29 = uVar36 >> 0x24 | uVar36 << 0x1c;
      uVar27 = ~uVar2 & uVar29 ^ uVar24;
      uVar37 = uVar37 ^ uVar18;
      uVar36 = uVar37 >> 0x3d | uVar37 << 3;
      uVar10 = ~uVar24 & uVar2 ^ uVar36;
      uVar26 = ~uVar7 & uVar36 ^ uVar29;
      uVar36 = ~uVar36 & uVar24 ^ uVar7;
      uVar2 = ~uVar29 & uVar7 ^ uVar2;
      uVar6 = uVar6 ^ uVar21;
      uVar5 = uVar5 ^ uVar35;
      uVar24 = uVar6 >> 0x27 | uVar6 << 0x19;
      uVar29 = uVar5 >> 0x3f | uVar5 << 1;
      uVar40 = uVar40 ^ uVar4;
      uVar40 = uVar40 >> 0x38 | uVar40 << 8;
      uVar6 = ~uVar12 & uVar29 ^ uVar40;
      uVar1 = ~uVar40 & uVar12 ^ uVar24;
      uVar22 = uVar22 ^ uVar34;
      uVar7 = uVar22 >> 0x3a | uVar22 << 6;
      uVar20 = ~uVar24 & uVar40 ^ uVar7;
      uVar22 = ~uVar7 & uVar24 ^ uVar29;
      uVar17 = uVar17 ^ uVar34;
      uVar34 = uVar34 ^ uVar14;
      uVar12 = ~uVar29 & uVar7 ^ uVar12;
      uVar8 = uVar8 ^ uVar4;
      uVar4 = uVar4 ^ uVar16;
      uVar29 = uVar8 >> 0x25 | uVar8 << 0x1b;
      uVar23 = uVar23 ^ uVar18;
      uVar5 = uVar4 >> 0x19 | uVar4 << 0x27;
      uVar7 = uVar23 >> 0x1c | uVar23 << 0x24;
      uVar31 = uVar31 ^ uVar35;
      uVar35 = uVar35 ^ uVar38;
      uVar24 = uVar31 >> 0x36 | uVar31 << 10;
      uVar8 = ~uVar7 & uVar24 ^ uVar29;
      uVar16 = uVar17 >> 0x31 | uVar17 << 0xf;
      uVar37 = ~uVar24 & uVar16 ^ uVar7;
      uVar28 = uVar28 ^ uVar21;
      uVar21 = uVar21 ^ uVar13;
      uVar40 = uVar28 >> 8 | uVar28 << 0x38;
      uVar24 = ~uVar16 & uVar40 ^ uVar24;
      uVar31 = ~uVar29 & uVar7 ^ uVar40;
      uVar16 = ~uVar40 & uVar29 ^ uVar16;
      uVar29 = uVar34 >> 2 | uVar34 << 0x3e;
      uVar23 = uVar35 >> 0x3e | uVar35 << 2;
      uVar40 = uVar21 >> 9 | uVar21 << 0x37;
      uVar18 = uVar18 ^ uVar3;
      uVar38 = ~uVar29 & uVar40 ^ uVar23;
      uVar14 = ~uVar40 & uVar5 ^ uVar29;
      uVar7 = uVar12 ^ uVar31 ^ uVar30 ^ uVar2 ^ uVar38;
      uVar17 = uVar22 ^ uVar8 ^ uVar25 ^ uVar26 ^ uVar14;
      uVar3 = uVar18 >> 0x17 | uVar18 << 0x29;
      uVar13 = ~uVar23 & uVar29 ^ uVar3;
      uVar40 = ~uVar5 & uVar3 ^ uVar40;
      uVar5 = ~uVar3 & uVar23 ^ uVar5;
      uVar3 = uVar6 ^ uVar16 ^ uVar19 ^ uVar27 ^ uVar13;
      uVar29 = uVar20 ^ uVar37 ^ uVar11 ^ uVar36 ^ uVar40;
      uVar18 = uVar1 ^ uVar24 ^ uVar33 ^ uVar10 ^ uVar5;
      uVar28 = (uVar3 >> 0x3f | uVar3 << 1) ^ uVar29;
      uVar34 = (uVar29 >> 0x3f | uVar29 << 1) ^ uVar7;
      uVar5 = uVar5 ^ uVar28;
      uVar21 = (uVar7 >> 0x3f | uVar7 << 1) ^ uVar18;
      uVar7 = uVar5 >> 3 | uVar5 << 0x3d;
      uVar14 = uVar14 ^ uVar34;
      uVar4 = (uVar18 >> 0x3f | uVar18 << 1) ^ uVar17;
      uVar25 = uVar25 ^ uVar34;
      uVar16 = uVar16 ^ uVar21;
      uVar36 = uVar36 ^ uVar4;
      uVar3 = (uVar17 >> 0x3f | uVar17 << 1) ^ uVar3;
      uVar29 = uVar36 >> 0x14 | uVar36 << 0x2c;
      uVar38 = uVar38 ^ uVar3;
      uVar1 = uVar1 ^ uVar28;
      uVar36 = uVar1 >> 0x15 | uVar1 << 0x2b;
      uVar32 = uVar25 ^ 0x8000000000008089 ^ ~uVar29 & uVar36;
      uVar18 = uVar16 >> 0x2b | uVar16 << 0x15;
      uVar16 = uVar38 >> 0x32 | uVar38 << 0xe;
      uVar38 = ~uVar18 & uVar16 ^ uVar36;
      uVar23 = ~uVar16 & uVar25 ^ uVar18;
      uVar5 = ~uVar36 & uVar18 ^ uVar29;
      uVar16 = ~uVar25 & uVar29 ^ uVar16;
      uVar19 = uVar19 ^ uVar21;
      uVar29 = uVar19 >> 0x24 | uVar19 << 0x1c;
      uVar37 = uVar37 ^ uVar4;
      uVar2 = uVar2 ^ uVar3;
      uVar18 = uVar37 >> 0x13 | uVar37 << 0x2d;
      uVar25 = ~uVar7 & uVar29 ^ uVar18;
      uVar36 = uVar2 >> 0x2c | uVar2 << 0x14;
      uVar22 = uVar22 ^ uVar34;
      uVar2 = uVar22 >> 0x3d | uVar22 << 3;
      uVar22 = ~uVar18 & uVar7 ^ uVar2;
      uVar17 = ~uVar2 & uVar18 ^ uVar36;
      uVar37 = ~uVar36 & uVar2 ^ uVar29;
      uVar7 = ~uVar29 & uVar36 ^ uVar7;
      uVar36 = uVar14 >> 0x2e | uVar14 << 0x12;
      uVar11 = uVar11 ^ uVar4;
      uVar31 = uVar31 ^ uVar3;
      uVar29 = uVar11 >> 0x3f | uVar11 << 1;
      uVar6 = uVar6 ^ uVar21;
      uVar1 = uVar31 >> 0x38 | uVar31 << 8;
      uVar18 = uVar6 >> 0x27 | uVar6 << 0x19;
      uVar39 = ~uVar1 & uVar36 ^ uVar18;
      uVar6 = ~uVar36 & uVar29 ^ uVar1;
      uVar10 = uVar10 ^ uVar28;
      uVar2 = uVar10 >> 0x3a | uVar10 << 6;
      uVar14 = ~uVar18 & uVar1 ^ uVar2;
      uVar11 = ~uVar2 & uVar18 ^ uVar29;
      uVar36 = ~uVar29 & uVar2 ^ uVar36;
      uVar30 = uVar30 ^ uVar3;
      uVar26 = uVar26 ^ uVar34;
      uVar34 = uVar34 ^ uVar8;
      uVar3 = uVar3 ^ uVar12;
      uVar8 = uVar30 >> 0x25 | uVar30 << 0x1b;
      uVar1 = uVar26 >> 0x1c | uVar26 << 0x24;
      uVar20 = uVar20 ^ uVar4;
      uVar4 = uVar4 ^ uVar40;
      uVar40 = uVar20 >> 0x36 | uVar20 << 10;
      uVar29 = ~uVar1 & uVar40 ^ uVar8;
      uVar12 = uVar4 >> 0x3e | uVar4 << 2;
      uVar24 = uVar24 ^ uVar28;
      uVar28 = uVar28 ^ uVar33;
      uVar18 = uVar24 >> 0x31 | uVar24 << 0xf;
      uVar30 = ~uVar40 & uVar18 ^ uVar1;
      uVar13 = uVar13 ^ uVar21;
      uVar21 = uVar21 ^ uVar27;
      uVar2 = uVar13 >> 8 | uVar13 << 0x38;
      uVar40 = ~uVar18 & uVar2 ^ uVar40;
      uVar18 = ~uVar2 & uVar8 ^ uVar18;
      uVar4 = uVar28 >> 2 | uVar28 << 0x3e;
      uVar2 = ~uVar8 & uVar1 ^ uVar2;
      uVar8 = uVar34 >> 0x17 | uVar34 << 0x29;
      uVar26 = ~uVar12 & uVar4 ^ uVar8;
      uVar24 = uVar21 >> 9 | uVar21 << 0x37;
      uVar10 = uVar3 >> 0x19 | uVar3 << 0x27;
      uVar1 = uVar6 ^ uVar18 ^ uVar23 ^ uVar25 ^ uVar26;
      uVar35 = ~uVar10 & uVar8 ^ uVar24;
      uVar31 = ~uVar24 & uVar10 ^ uVar4;
      uVar10 = ~uVar8 & uVar12 ^ uVar10;
      uVar12 = ~uVar4 & uVar24 ^ uVar12;
      uVar24 = uVar14 ^ uVar30 ^ uVar5 ^ uVar17 ^ uVar35;
      uVar13 = uVar11 ^ uVar29 ^ uVar32 ^ uVar37 ^ uVar31;
      uVar21 = uVar39 ^ uVar40 ^ uVar38 ^ uVar22 ^ uVar10;
      uVar19 = (uVar1 >> 0x3f | uVar1 << 1) ^ uVar24;
      uVar3 = uVar36 ^ uVar2 ^ uVar16 ^ uVar7 ^ uVar12;
      uVar1 = (uVar13 >> 0x3f | uVar13 << 1) ^ uVar1;
      uVar20 = (uVar24 >> 0x3f | uVar24 << 1) ^ uVar3;
      uVar13 = (uVar21 >> 0x3f | uVar21 << 1) ^ uVar13;
      uVar39 = uVar39 ^ uVar19;
      uVar10 = uVar10 ^ uVar19;
      uVar21 = (uVar3 >> 0x3f | uVar3 << 1) ^ uVar21;
      uVar12 = uVar12 ^ uVar1;
      uVar24 = uVar10 >> 3 | uVar10 << 0x3d;
      uVar18 = uVar18 ^ uVar21;
      uVar12 = uVar12 >> 0x32 | uVar12 << 0xe;
      uVar18 = uVar18 >> 0x2b | uVar18 << 0x15;
      uVar17 = uVar17 ^ uVar13;
      uVar32 = uVar32 ^ uVar20;
      uVar3 = uVar17 >> 0x14 | uVar17 << 0x2c;
      uVar8 = uVar39 >> 0x15 | uVar39 << 0x2b;
      uVar27 = uVar32 ^ 0x8000000000008003 ^ ~uVar3 & uVar8;
      uVar28 = ~uVar18 & uVar12 ^ uVar8;
      uVar8 = ~uVar8 & uVar18 ^ uVar3;
      uVar18 = ~uVar12 & uVar32 ^ uVar18;
      uVar12 = ~uVar32 & uVar3 ^ uVar12;
      uVar31 = uVar31 ^ uVar20;
      uVar23 = uVar23 ^ uVar21;
      uVar30 = uVar30 ^ uVar13;
      uVar7 = uVar7 ^ uVar1;
      uVar3 = uVar23 >> 0x24 | uVar23 << 0x1c;
      uVar10 = uVar30 >> 0x13 | uVar30 << 0x2d;
      uVar7 = uVar7 >> 0x2c | uVar7 << 0x14;
      uVar34 = ~uVar24 & uVar3 ^ uVar10;
      uVar11 = uVar11 ^ uVar20;
      uVar30 = uVar11 >> 0x3d | uVar11 << 3;
      uVar23 = ~uVar10 & uVar24 ^ uVar30;
      uVar10 = ~uVar30 & uVar10 ^ uVar7;
      uVar4 = ~uVar7 & uVar30 ^ uVar3;
      uVar24 = ~uVar3 & uVar7 ^ uVar24;
      uVar7 = uVar31 >> 0x2e | uVar31 << 0x12;
      uVar5 = uVar5 ^ uVar13;
      uVar2 = uVar2 ^ uVar1;
      uVar3 = uVar5 >> 0x3f | uVar5 << 1;
      uVar6 = uVar6 ^ uVar21;
      uVar11 = uVar2 >> 0x38 | uVar2 << 8;
      uVar2 = uVar6 >> 0x27 | uVar6 << 0x19;
      uVar32 = ~uVar7 & uVar3 ^ uVar11;
      uVar17 = ~uVar11 & uVar7 ^ uVar2;
      uVar22 = uVar22 ^ uVar19;
      uVar30 = uVar22 >> 0x3a | uVar22 << 6;
      uVar33 = ~uVar2 & uVar11 ^ uVar30;
      uVar6 = ~uVar30 & uVar2 ^ uVar3;
      uVar7 = ~uVar3 & uVar30 ^ uVar7;
      uVar37 = uVar37 ^ uVar20;
      uVar38 = uVar19 ^ uVar38;
      uVar3 = uVar37 >> 0x1c | uVar37 << 0x24;
      uVar16 = uVar16 ^ uVar1;
      uVar40 = uVar40 ^ uVar19;
      uVar1 = uVar1 ^ uVar36;
      uVar36 = uVar16 >> 0x25 | uVar16 << 0x1b;
      uVar40 = uVar40 >> 0x31 | uVar40 << 0xf;
      uVar14 = uVar14 ^ uVar13;
      uVar13 = uVar13 ^ uVar35;
      uVar5 = uVar14 >> 0x36 | uVar14 << 10;
      uVar11 = ~uVar3 & uVar5 ^ uVar36;
      uVar30 = ~uVar5 & uVar40 ^ uVar3;
      uVar26 = uVar26 ^ uVar21;
      uVar21 = uVar21 ^ uVar25;
      uVar16 = uVar26 >> 8 | uVar26 << 0x38;
      uVar2 = ~uVar36 & uVar3 ^ uVar16;
      uVar5 = ~uVar40 & uVar16 ^ uVar5;
      uVar37 = uVar1 >> 0x19 | uVar1 << 0x27;
      uVar40 = ~uVar16 & uVar36 ^ uVar40;
      uVar36 = uVar38 >> 2 | uVar38 << 0x3e;
      uVar22 = uVar21 >> 9 | uVar21 << 0x37;
      uVar20 = uVar20 ^ uVar29;
      uVar3 = uVar20 >> 0x17 | uVar20 << 0x29;
      uVar16 = uVar13 >> 0x3e | uVar13 << 2;
      uVar21 = ~uVar37 & uVar3 ^ uVar22;
      uVar1 = ~uVar16 & uVar36 ^ uVar3;
      uVar25 = ~uVar3 & uVar16 ^ uVar37;
      uVar3 = uVar32 ^ uVar40 ^ uVar18 ^ uVar34 ^ uVar1;
      uVar26 = ~uVar22 & uVar37 ^ uVar36;
      uVar37 = uVar17 ^ uVar5 ^ uVar28 ^ uVar23 ^ uVar25;
      uVar29 = uVar33 ^ uVar30 ^ uVar8 ^ uVar10 ^ uVar21;
      uVar16 = ~uVar36 & uVar22 ^ uVar16;
      uVar36 = uVar6 ^ uVar11 ^ uVar27 ^ uVar4 ^ uVar26;
      uVar22 = uVar7 ^ uVar2 ^ uVar12 ^ uVar24 ^ uVar16;
      uVar20 = (uVar3 >> 0x3f | uVar3 << 1) ^ uVar29;
      uVar31 = (uVar29 >> 0x3f | uVar29 << 1) ^ uVar22;
      uVar19 = (uVar22 >> 0x3f | uVar22 << 1) ^ uVar37;
      uVar13 = (uVar37 >> 0x3f | uVar37 << 1) ^ uVar36;
      uVar27 = uVar27 ^ uVar31;
      uVar40 = uVar40 ^ uVar19;
      uVar10 = uVar10 ^ uVar13;
      uVar3 = (uVar36 >> 0x3f | uVar36 << 1) ^ uVar3;
      uVar29 = uVar10 >> 0x14 | uVar10 << 0x2c;
      uVar16 = uVar16 ^ uVar3;
      uVar16 = uVar16 >> 0x32 | uVar16 << 0xe;
      uVar17 = uVar17 ^ uVar20;
      uVar36 = uVar17 >> 0x15 | uVar17 << 0x2b;
      uVar22 = uVar27 ^ 0x8000000000008002 ^ ~uVar29 & uVar36;
      uVar10 = uVar40 >> 0x2b | uVar40 << 0x15;
      uVar40 = ~uVar16 & uVar27 ^ uVar10;
      uVar35 = ~uVar10 & uVar16 ^ uVar36;
      uVar26 = uVar26 ^ uVar31;
      uVar10 = ~uVar36 & uVar10 ^ uVar29;
      uVar16 = ~uVar27 & uVar29 ^ uVar16;
      uVar6 = uVar6 ^ uVar31;
      uVar37 = uVar6 >> 0x3d | uVar6 << 3;
      uVar24 = uVar24 ^ uVar3;
      uVar18 = uVar18 ^ uVar19;
      uVar17 = uVar24 >> 0x2c | uVar24 << 0x14;
      uVar29 = uVar18 >> 0x24 | uVar18 << 0x1c;
      uVar14 = ~uVar17 & uVar37 ^ uVar29;
      uVar25 = uVar25 ^ uVar20;
      uVar24 = uVar25 >> 3 | uVar25 << 0x3d;
      uVar30 = uVar30 ^ uVar13;
      uVar36 = uVar30 >> 0x13 | uVar30 << 0x2d;
      uVar30 = ~uVar29 & uVar17 ^ uVar24;
      uVar6 = ~uVar24 & uVar29 ^ uVar36;
      uVar17 = ~uVar37 & uVar36 ^ uVar17;
      uVar37 = ~uVar36 & uVar24 ^ uVar37;
      uVar36 = uVar26 >> 0x2e | uVar26 << 0x12;
      uVar8 = uVar8 ^ uVar13;
      uVar32 = uVar32 ^ uVar19;
      uVar23 = uVar23 ^ uVar20;
      uVar2 = uVar2 ^ uVar3;
      uVar29 = uVar8 >> 0x3f | uVar8 << 1;
      uVar8 = uVar32 >> 0x27 | uVar32 << 0x19;
      uVar24 = uVar23 >> 0x3a | uVar23 << 6;
      uVar2 = uVar2 >> 0x38 | uVar2 << 8;
      uVar26 = ~uVar36 & uVar29 ^ uVar2;
      uVar27 = ~uVar24 & uVar8 ^ uVar29;
      uVar18 = ~uVar2 & uVar36 ^ uVar8;
      uVar32 = ~uVar8 & uVar2 ^ uVar24;
      uVar36 = ~uVar29 & uVar24 ^ uVar36;
      uVar12 = uVar12 ^ uVar3;
      uVar4 = uVar4 ^ uVar31;
      uVar3 = uVar3 ^ uVar7;
      uVar12 = uVar12 >> 0x25 | uVar12 << 0x1b;
      uVar24 = uVar4 >> 0x1c | uVar4 << 0x24;
      uVar33 = uVar33 ^ uVar13;
      uVar5 = uVar5 ^ uVar20;
      uVar13 = uVar13 ^ uVar21;
      uVar20 = uVar20 ^ uVar28;
      uVar25 = uVar33 >> 0x36 | uVar33 << 10;
      uVar29 = ~uVar24 & uVar25 ^ uVar12;
      uVar7 = uVar5 >> 0x31 | uVar5 << 0xf;
      uVar8 = ~uVar25 & uVar7 ^ uVar24;
      uVar1 = uVar1 ^ uVar19;
      uVar19 = uVar19 ^ uVar34;
      uVar2 = uVar1 >> 8 | uVar1 << 0x38;
      uVar4 = ~uVar12 & uVar24 ^ uVar2;
      uVar25 = ~uVar7 & uVar2 ^ uVar25;
      uVar7 = ~uVar2 & uVar12 ^ uVar7;
      uVar2 = uVar13 >> 0x3e | uVar13 << 2;
      uVar31 = uVar31 ^ uVar11;
      uVar11 = uVar19 >> 9 | uVar19 << 0x37;
      uVar12 = uVar3 >> 0x19 | uVar3 << 0x27;
      uVar3 = uVar20 >> 2 | uVar20 << 0x3e;
      uVar24 = uVar31 >> 0x17 | uVar31 << 0x29;
      uVar13 = ~uVar2 & uVar3 ^ uVar24;
      uVar20 = ~uVar24 & uVar2 ^ uVar12;
      uVar38 = ~uVar12 & uVar24 ^ uVar11;
      uVar23 = uVar26 ^ uVar7 ^ uVar40 ^ uVar6 ^ uVar13;
      uVar12 = ~uVar11 & uVar12 ^ uVar3;
      uVar24 = uVar32 ^ uVar8 ^ uVar10 ^ uVar17 ^ uVar38;
      uVar1 = uVar18 ^ uVar25 ^ uVar35 ^ uVar37 ^ uVar20;
      uVar2 = ~uVar3 & uVar11 ^ uVar2;
      uVar11 = uVar27 ^ uVar29 ^ uVar22 ^ uVar14 ^ uVar12;
      uVar19 = (uVar23 >> 0x3f | uVar23 << 1) ^ uVar24;
      uVar3 = uVar36 ^ uVar4 ^ uVar16 ^ uVar30 ^ uVar2;
      uVar28 = (uVar1 >> 0x3f | uVar1 << 1) ^ uVar11;
      uVar20 = uVar20 ^ uVar19;
      uVar21 = (uVar24 >> 0x3f | uVar24 << 1) ^ uVar3;
      uVar23 = (uVar11 >> 0x3f | uVar11 << 1) ^ uVar23;
      uVar1 = (uVar3 >> 0x3f | uVar3 << 1) ^ uVar1;
      uVar18 = uVar18 ^ uVar19;
      uVar2 = uVar2 ^ uVar23;
      uVar5 = uVar18 >> 0x15 | uVar18 << 0x2b;
      uVar7 = uVar7 ^ uVar1;
      uVar3 = uVar2 >> 0x32 | uVar2 << 0xe;
      uVar24 = uVar7 >> 0x2b | uVar7 << 0x15;
      uVar17 = uVar17 ^ uVar28;
      uVar7 = uVar17 >> 0x14 | uVar17 << 0x2c;
      uVar22 = uVar22 ^ uVar21;
      uVar12 = uVar12 ^ uVar21;
      uVar12 = uVar12 >> 0x2e | uVar12 << 0x12;
      uVar11 = uVar22 ^ 0x8000000000000080 ^ ~uVar7 & uVar5;
      uVar18 = ~uVar5 & uVar24 ^ uVar7;
      uVar5 = ~uVar24 & uVar3 ^ uVar5;
      uVar24 = ~uVar3 & uVar22 ^ uVar24;
      uVar3 = ~uVar22 & uVar7 ^ uVar3;
      uVar8 = uVar8 ^ uVar28;
      uVar27 = uVar27 ^ uVar21;
      uVar40 = uVar40 ^ uVar1;
      uVar22 = uVar8 >> 0x13 | uVar8 << 0x2d;
      uVar2 = uVar20 >> 3 | uVar20 << 0x3d;
      uVar30 = uVar30 ^ uVar23;
      uVar31 = uVar27 >> 0x3d | uVar27 << 3;
      uVar7 = uVar40 >> 0x24 | uVar40 << 0x1c;
      uVar30 = uVar30 >> 0x2c | uVar30 << 0x14;
      uVar17 = ~uVar31 & uVar22 ^ uVar30;
      uVar34 = ~uVar2 & uVar7 ^ uVar22;
      uVar8 = ~uVar30 & uVar31 ^ uVar7;
      uVar31 = ~uVar22 & uVar2 ^ uVar31;
      uVar2 = ~uVar7 & uVar30 ^ uVar2;
      uVar10 = uVar10 ^ uVar28;
      uVar4 = uVar4 ^ uVar23;
      uVar7 = uVar10 >> 0x3f | uVar10 << 1;
      uVar26 = uVar26 ^ uVar1;
      uVar10 = uVar4 >> 0x38 | uVar4 << 8;
      uVar40 = uVar26 >> 0x27 | uVar26 << 0x19;
      uVar22 = ~uVar10 & uVar12 ^ uVar40;
      uVar4 = ~uVar12 & uVar7 ^ uVar10;
      uVar37 = uVar37 ^ uVar19;
      uVar30 = uVar37 >> 0x3a | uVar37 << 6;
      uVar27 = ~uVar40 & uVar10 ^ uVar30;
      uVar14 = uVar14 ^ uVar21;
      uVar20 = ~uVar30 & uVar40 ^ uVar7;
      uVar10 = uVar14 >> 0x1c | uVar14 << 0x24;
      uVar12 = ~uVar7 & uVar30 ^ uVar12;
      uVar16 = uVar16 ^ uVar23;
      uVar23 = uVar23 ^ uVar36;
      uVar32 = uVar32 ^ uVar28;
      uVar7 = uVar16 >> 0x25 | uVar16 << 0x1b;
      uVar33 = uVar32 >> 0x36 | uVar32 << 10;
      uVar36 = ~uVar10 & uVar33 ^ uVar7;
      uVar25 = uVar25 ^ uVar19;
      uVar19 = uVar19 ^ uVar35;
      uVar16 = uVar25 >> 0x31 | uVar25 << 0xf;
      uVar30 = ~uVar33 & uVar16 ^ uVar10;
      uVar13 = uVar13 ^ uVar1;
      uVar40 = uVar13 >> 8 | uVar13 << 0x38;
      uVar33 = ~uVar16 & uVar40 ^ uVar33;
      uVar37 = ~uVar7 & uVar10 ^ uVar40;
      uVar16 = ~uVar40 & uVar7 ^ uVar16;
      uVar7 = uVar19 >> 2 | uVar19 << 0x3e;
      uVar1 = uVar1 ^ uVar6;
      uVar28 = uVar28 ^ uVar38;
      uVar21 = uVar21 ^ uVar29;
      uVar29 = uVar1 >> 9 | uVar1 << 0x37;
      uVar40 = uVar23 >> 0x19 | uVar23 << 0x27;
      uVar10 = uVar28 >> 0x3e | uVar28 << 2;
      uVar1 = uVar21 >> 0x17 | uVar21 << 0x29;
      uVar6 = ~uVar10 & uVar7 ^ uVar1;
      uVar21 = ~uVar40 & uVar1 ^ uVar29;
      uVar14 = ~uVar1 & uVar10 ^ uVar40;
      uVar25 = uVar4 ^ uVar16 ^ uVar24 ^ uVar34 ^ uVar6;
      uVar10 = ~uVar7 & uVar29 ^ uVar10;
      uVar23 = uVar27 ^ uVar30 ^ uVar18 ^ uVar17 ^ uVar21;
      uVar7 = ~uVar29 & uVar40 ^ uVar7;
      uVar13 = uVar22 ^ uVar33 ^ uVar5 ^ uVar31 ^ uVar14;
      uVar1 = uVar12 ^ uVar37 ^ uVar3 ^ uVar2 ^ uVar10;
      uVar29 = uVar20 ^ uVar36 ^ uVar11 ^ uVar8 ^ uVar7;
      uVar40 = (uVar25 >> 0x3f | uVar25 << 1) ^ uVar23;
      uVar19 = (uVar23 >> 0x3f | uVar23 << 1) ^ uVar1;
      uVar22 = uVar22 ^ uVar40;
      uVar32 = (uVar13 >> 0x3f | uVar13 << 1) ^ uVar29;
      uVar13 = (uVar1 >> 0x3f | uVar1 << 1) ^ uVar13;
      uVar25 = (uVar29 >> 0x3f | uVar29 << 1) ^ uVar25;
      uVar26 = uVar22 >> 0x15 | uVar22 << 0x2b;
      uVar7 = uVar7 ^ uVar19;
      uVar10 = uVar10 ^ uVar25;
      uVar16 = uVar16 ^ uVar13;
      uVar7 = uVar7 >> 0x2e | uVar7 << 0x12;
      uVar22 = uVar10 >> 0x32 | uVar10 << 0xe;
      uVar29 = uVar16 >> 0x2b | uVar16 << 0x15;
      uVar11 = uVar11 ^ uVar19;
      uVar1 = ~uVar29 & uVar22 ^ uVar26;
      uVar17 = uVar17 ^ uVar32;
      uVar16 = uVar17 >> 0x14 | uVar17 << 0x2c;
      uVar23 = ~uVar22 & uVar11 ^ uVar29;
      uVar10 = ~uVar26 & uVar29 ^ uVar16;
      uVar22 = ~uVar11 & uVar16 ^ uVar22;
      uVar26 = uVar11 ^ 0x800a ^ ~uVar16 & uVar26;
      uVar24 = uVar24 ^ uVar13;
      uVar2 = uVar2 ^ uVar25;
      uVar20 = uVar20 ^ uVar19;
      uVar14 = uVar14 ^ uVar40;
      uVar29 = uVar24 >> 0x24 | uVar24 << 0x1c;
      uVar2 = uVar2 >> 0x2c | uVar2 << 0x14;
      uVar16 = uVar14 >> 3 | uVar14 << 0x3d;
      uVar11 = uVar20 >> 0x3d | uVar20 << 3;
      uVar30 = uVar30 ^ uVar32;
      uVar17 = uVar30 >> 0x13 | uVar30 << 0x2d;
      uVar24 = ~uVar16 & uVar29 ^ uVar17;
      uVar30 = ~uVar11 & uVar17 ^ uVar2;
      uVar17 = ~uVar17 & uVar16 ^ uVar11;
      uVar11 = ~uVar2 & uVar11 ^ uVar29;
      uVar16 = ~uVar29 & uVar2 ^ uVar16;
      uVar4 = uVar4 ^ uVar13;
      uVar4 = uVar4 >> 0x27 | uVar4 << 0x19;
      uVar31 = uVar31 ^ uVar40;
      uVar2 = uVar31 >> 0x3a | uVar31 << 6;
      uVar18 = uVar18 ^ uVar32;
      uVar29 = uVar18 >> 0x3f | uVar18 << 1;
      uVar37 = uVar37 ^ uVar25;
      uVar18 = uVar37 >> 0x38 | uVar37 << 8;
      uVar20 = ~uVar7 & uVar29 ^ uVar18;
      uVar14 = ~uVar18 & uVar7 ^ uVar4;
      uVar31 = ~uVar4 & uVar18 ^ uVar2;
      uVar4 = ~uVar2 & uVar4 ^ uVar29;
      uVar7 = ~uVar29 & uVar2 ^ uVar7;
      uVar27 = uVar27 ^ uVar32;
      uVar32 = uVar32 ^ uVar21;
      uVar3 = uVar3 ^ uVar25;
      uVar37 = uVar27 >> 0x36 | uVar27 << 10;
      uVar25 = uVar25 ^ uVar12;
      uVar8 = uVar8 ^ uVar19;
      uVar2 = uVar3 >> 0x25 | uVar3 << 0x1b;
      uVar12 = uVar8 >> 0x1c | uVar8 << 0x24;
      uVar3 = ~uVar12 & uVar37 ^ uVar2;
      uVar33 = uVar33 ^ uVar40;
      uVar40 = uVar40 ^ uVar5;
      uVar5 = uVar33 >> 0x31 | uVar33 << 0xf;
      uVar27 = ~uVar37 & uVar5 ^ uVar12;
      uVar6 = uVar6 ^ uVar13;
      uVar13 = uVar13 ^ uVar34;
      uVar29 = uVar6 >> 8 | uVar6 << 0x38;
      uVar37 = ~uVar5 & uVar29 ^ uVar37;
      uVar6 = uVar40 >> 2 | uVar40 << 0x3e;
      uVar40 = ~uVar2 & uVar12 ^ uVar29;
      uVar5 = ~uVar29 & uVar2 ^ uVar5;
      uVar19 = uVar19 ^ uVar36;
      uVar29 = uVar13 >> 9 | uVar13 << 0x37;
      uVar12 = uVar25 >> 0x19 | uVar25 << 0x27;
      uVar18 = uVar32 >> 0x3e | uVar32 << 2;
      uVar36 = uVar19 >> 0x17 | uVar19 << 0x29;
      uVar8 = ~uVar18 & uVar6 ^ uVar36;
      uVar2 = ~uVar36 & uVar18 ^ uVar12;
      uVar28 = ~uVar12 & uVar36 ^ uVar29;
      uVar21 = uVar20 ^ uVar5 ^ uVar23 ^ uVar24 ^ uVar8;
      uVar18 = ~uVar6 & uVar29 ^ uVar18;
      uVar36 = uVar31 ^ uVar27 ^ uVar10 ^ uVar30 ^ uVar28;
      uVar6 = ~uVar29 & uVar12 ^ uVar6;
      uVar13 = uVar14 ^ uVar37 ^ uVar1 ^ uVar17 ^ uVar2;
      uVar29 = uVar7 ^ uVar40 ^ uVar22 ^ uVar16 ^ uVar18;
      uVar12 = uVar4 ^ uVar3 ^ uVar26 ^ uVar11 ^ uVar6;
      uVar32 = (uVar21 >> 0x3f | uVar21 << 1) ^ uVar36;
      uVar38 = (uVar36 >> 0x3f | uVar36 << 1) ^ uVar29;
      uVar34 = (uVar13 >> 0x3f | uVar13 << 1) ^ uVar12;
      uVar2 = uVar2 ^ uVar32;
      uVar13 = (uVar29 >> 0x3f | uVar29 << 1) ^ uVar13;
      uVar27 = uVar27 ^ uVar34;
      uVar36 = uVar2 >> 3 | uVar2 << 0x3d;
      uVar6 = uVar6 ^ uVar38;
      uVar21 = (uVar12 >> 0x3f | uVar12 << 1) ^ uVar21;
      uVar5 = uVar5 ^ uVar13;
      uVar2 = uVar6 >> 0x2e | uVar6 << 0x12;
      uVar14 = uVar14 ^ uVar32;
      uVar18 = uVar18 ^ uVar21;
      uVar12 = uVar5 >> 0x2b | uVar5 << 0x15;
      uVar33 = uVar14 >> 0x15 | uVar14 << 0x2b;
      uVar18 = uVar18 >> 0x32 | uVar18 << 0xe;
      uVar30 = uVar30 ^ uVar34;
      uVar26 = uVar26 ^ uVar38;
      uVar29 = uVar30 >> 0x14 | uVar30 << 0x2c;
      uVar25 = uVar26 ^ 0x800000008000000a ^ ~uVar29 & uVar33;
      uVar6 = ~uVar33 & uVar12 ^ uVar29;
      uVar33 = ~uVar12 & uVar18 ^ uVar33;
      uVar29 = ~uVar26 & uVar29 ^ uVar18;
      uVar12 = ~uVar18 & uVar26 ^ uVar12;
      uVar5 = uVar27 >> 0x13 | uVar27 << 0x2d;
      uVar16 = uVar16 ^ uVar21;
      uVar23 = uVar23 ^ uVar13;
      uVar18 = uVar16 >> 0x2c | uVar16 << 0x14;
      uVar16 = uVar23 >> 0x24 | uVar23 << 0x1c;
      uVar4 = uVar4 ^ uVar38;
      uVar23 = uVar4 >> 0x3d | uVar4 << 3;
      uVar27 = ~uVar36 & uVar16 ^ uVar5;
      uVar30 = ~uVar23 & uVar5 ^ uVar18;
      uVar5 = ~uVar5 & uVar36 ^ uVar23;
      uVar14 = ~uVar18 & uVar23 ^ uVar16;
      uVar36 = ~uVar16 & uVar18 ^ uVar36;
      uVar40 = uVar40 ^ uVar21;
      uVar10 = uVar10 ^ uVar34;
      uVar23 = uVar40 >> 0x38 | uVar40 << 8;
      uVar16 = uVar10 >> 0x3f | uVar10 << 1;
      uVar20 = uVar20 ^ uVar13;
      uVar40 = uVar20 >> 0x27 | uVar20 << 0x19;
      uVar19 = ~uVar2 & uVar16 ^ uVar23;
      uVar10 = ~uVar23 & uVar2 ^ uVar40;
      uVar17 = uVar17 ^ uVar32;
      uVar18 = uVar17 >> 0x3a | uVar17 << 6;
      uVar20 = ~uVar40 & uVar23 ^ uVar18;
      uVar23 = ~uVar18 & uVar40 ^ uVar16;
      uVar2 = ~uVar16 & uVar18 ^ uVar2;
      uVar11 = uVar11 ^ uVar38;
      uVar38 = uVar38 ^ uVar3;
      uVar18 = uVar11 >> 0x1c | uVar11 << 0x24;
      uVar22 = uVar22 ^ uVar21;
      uVar21 = uVar21 ^ uVar7;
      uVar31 = uVar31 ^ uVar34;
      uVar7 = uVar22 >> 0x25 | uVar22 << 0x1b;
      uVar34 = uVar34 ^ uVar28;
      uVar11 = uVar31 >> 0x36 | uVar31 << 10;
      uVar40 = ~uVar18 & uVar11 ^ uVar7;
      uVar34 = uVar34 >> 0x3e | uVar34 << 2;
      uVar37 = uVar37 ^ uVar32;
      uVar32 = uVar32 ^ uVar1;
      uVar17 = uVar37 >> 0x31 | uVar37 << 0xf;
      uVar1 = ~uVar11 & uVar17 ^ uVar18;
      uVar8 = uVar8 ^ uVar13;
      uVar13 = uVar13 ^ uVar24;
      uVar3 = uVar8 >> 8 | uVar8 << 0x38;
      uVar11 = ~uVar17 & uVar3 ^ uVar11;
      uVar17 = ~uVar3 & uVar7 ^ uVar17;
      uVar24 = uVar21 >> 0x19 | uVar21 << 0x27;
      uVar16 = uVar38 >> 0x17 | uVar38 << 0x29;
      uVar3 = ~uVar7 & uVar18 ^ uVar3;
      uVar7 = uVar13 >> 9 | uVar13 << 0x37;
      uVar22 = ~uVar16 & uVar34 ^ uVar24;
      uVar31 = uVar10 ^ uVar11 ^ uVar33 ^ uVar5 ^ uVar22;
      uVar18 = uVar32 >> 2 | uVar32 << 0x3e;
      uVar26 = ~uVar24 & uVar16 ^ uVar7;
      uVar24 = ~uVar7 & uVar24 ^ uVar18;
      uVar16 = ~uVar34 & uVar18 ^ uVar16;
      uVar34 = ~uVar18 & uVar7 ^ uVar34;
      uVar8 = uVar23 ^ uVar40 ^ uVar25 ^ uVar14 ^ uVar24;
      uVar37 = uVar20 ^ uVar1 ^ uVar6 ^ uVar30 ^ uVar26;
      uVar7 = uVar19 ^ uVar17 ^ uVar12 ^ uVar27 ^ uVar16;
      uVar4 = (uVar31 >> 0x3f | uVar31 << 1) ^ uVar8;
      uVar18 = uVar2 ^ uVar3 ^ uVar29 ^ uVar36 ^ uVar34;
      uVar32 = (uVar37 >> 0x3f | uVar37 << 1) ^ uVar18;
      uVar28 = (uVar8 >> 0x3f | uVar8 << 1) ^ uVar7;
      uVar37 = (uVar7 >> 0x3f | uVar7 << 1) ^ uVar37;
      uVar34 = uVar34 ^ uVar28;
      uVar24 = uVar24 ^ uVar32;
      uVar31 = (uVar18 >> 0x3f | uVar18 << 1) ^ uVar31;
      uVar22 = uVar22 ^ uVar37;
      uVar18 = uVar24 >> 0x2e | uVar24 << 0x12;
      uVar17 = uVar17 ^ uVar31;
      uVar30 = uVar30 ^ uVar4;
      uVar17 = uVar17 >> 0x2b | uVar17 << 0x15;
      uVar10 = uVar10 ^ uVar37;
      uVar7 = uVar30 >> 0x14 | uVar30 << 0x2c;
      uVar25 = uVar25 ^ uVar32;
      uVar24 = uVar10 >> 0x15 | uVar10 << 0x2b;
      uVar13 = uVar25 ^ 0x8000000080008081 ^ ~uVar7 & uVar24;
      uVar30 = uVar34 >> 0x32 | uVar34 << 0xe;
      uVar38 = ~uVar17 & uVar30 ^ uVar24;
      uVar8 = ~uVar30 & uVar25 ^ uVar17;
      uVar17 = ~uVar24 & uVar17 ^ uVar7;
      uVar24 = uVar22 >> 3 | uVar22 << 0x3d;
      uVar30 = ~uVar25 & uVar7 ^ uVar30;
      uVar36 = uVar36 ^ uVar28;
      uVar10 = uVar36 >> 0x2c | uVar36 << 0x14;
      uVar23 = uVar23 ^ uVar32;
      uVar36 = uVar23 >> 0x3d | uVar23 << 3;
      uVar12 = uVar12 ^ uVar31;
      uVar7 = uVar12 >> 0x24 | uVar12 << 0x1c;
      uVar1 = uVar1 ^ uVar4;
      uVar12 = uVar1 >> 0x13 | uVar1 << 0x2d;
      uVar35 = ~uVar24 & uVar7 ^ uVar12;
      uVar22 = ~uVar12 & uVar24 ^ uVar36;
      uVar12 = ~uVar36 & uVar12 ^ uVar10;
      uVar1 = ~uVar10 & uVar36 ^ uVar7;
      uVar24 = ~uVar7 & uVar10 ^ uVar24;
      uVar6 = uVar6 ^ uVar4;
      uVar3 = uVar3 ^ uVar28;
      uVar7 = uVar6 >> 0x3f | uVar6 << 1;
      uVar5 = uVar5 ^ uVar37;
      uVar6 = uVar3 >> 0x38 | uVar3 << 8;
      uVar3 = uVar5 >> 0x3a | uVar5 << 6;
      uVar23 = ~uVar18 & uVar7 ^ uVar6;
      uVar19 = uVar19 ^ uVar31;
      uVar36 = uVar19 >> 0x27 | uVar19 << 0x19;
      uVar34 = ~uVar6 & uVar18 ^ uVar36;
      uVar10 = ~uVar3 & uVar36 ^ uVar7;
      uVar21 = ~uVar36 & uVar6 ^ uVar3;
      uVar18 = ~uVar7 & uVar3 ^ uVar18;
      uVar29 = uVar29 ^ uVar28;
      uVar28 = uVar28 ^ uVar2;
      uVar29 = uVar29 >> 0x25 | uVar29 << 0x1b;
      uVar14 = uVar14 ^ uVar32;
      uVar7 = uVar14 >> 0x1c | uVar14 << 0x24;
      uVar25 = uVar28 >> 0x19 | uVar28 << 0x27;
      uVar20 = uVar20 ^ uVar4;
      uVar5 = uVar20 >> 0x36 | uVar20 << 10;
      uVar11 = uVar11 ^ uVar37;
      uVar37 = uVar37 ^ uVar33;
      uVar2 = ~uVar7 & uVar5 ^ uVar29;
      uVar11 = uVar11 >> 0x31 | uVar11 << 0xf;
      uVar36 = ~uVar5 & uVar11 ^ uVar7;
      uVar33 = uVar37 >> 2 | uVar37 << 0x3e;
      uVar16 = uVar16 ^ uVar31;
      uVar31 = uVar31 ^ uVar27;
      uVar3 = uVar16 >> 8 | uVar16 << 0x38;
      uVar20 = ~uVar29 & uVar7 ^ uVar3;
      uVar5 = ~uVar11 & uVar3 ^ uVar5;
      uVar32 = uVar32 ^ uVar40;
      uVar11 = ~uVar3 & uVar29 ^ uVar11;
      uVar4 = uVar4 ^ uVar26;
      uVar3 = uVar31 >> 9 | uVar31 << 0x37;
      uVar29 = uVar32 >> 0x17 | uVar32 << 0x29;
      uVar7 = uVar4 >> 0x3e | uVar4 << 2;
      uVar6 = ~uVar25 & uVar29 ^ uVar3;
      uVar37 = ~uVar7 & uVar33 ^ uVar29;
      uVar19 = uVar21 ^ uVar36 ^ uVar17 ^ uVar12 ^ uVar6;
      uVar16 = ~uVar33 & uVar3 ^ uVar7;
      uVar26 = ~uVar29 & uVar7 ^ uVar25;
      uVar40 = uVar23 ^ uVar11 ^ uVar8 ^ uVar35 ^ uVar37;
      uVar7 = uVar18 ^ uVar20 ^ uVar30 ^ uVar24 ^ uVar16;
      uVar29 = uVar34 ^ uVar5 ^ uVar38 ^ uVar22 ^ uVar26;
      uVar33 = ~uVar3 & uVar25 ^ uVar33;
      uVar3 = (uVar19 >> 0x3f | uVar19 << 1) ^ uVar7;
      uVar4 = uVar10 ^ uVar2 ^ uVar13 ^ uVar1 ^ uVar33;
      uVar19 = (uVar40 >> 0x3f | uVar40 << 1) ^ uVar19;
      uVar31 = (uVar7 >> 0x3f | uVar7 << 1) ^ uVar29;
      uVar28 = (uVar29 >> 0x3f | uVar29 << 1) ^ uVar4;
      uVar34 = uVar34 ^ uVar19;
      uVar26 = uVar26 ^ uVar19;
      uVar40 = (uVar4 >> 0x3f | uVar4 << 1) ^ uVar40;
      uVar7 = uVar34 >> 0x15 | uVar34 << 0x2b;
      uVar11 = uVar11 ^ uVar31;
      uVar16 = uVar16 ^ uVar40;
      uVar16 = uVar16 >> 0x32 | uVar16 << 0xe;
      uVar13 = uVar13 ^ uVar3;
      uVar12 = uVar12 ^ uVar28;
      uVar29 = uVar12 >> 0x14 | uVar12 << 0x2c;
      uVar4 = uVar13 ^ 0x8000000000008080 ^ ~uVar29 & uVar7;
      uVar11 = uVar11 >> 0x2b | uVar11 << 0x15;
      uVar12 = ~uVar16 & uVar13 ^ uVar11;
      uVar32 = ~uVar11 & uVar16 ^ uVar7;
      uVar11 = ~uVar7 & uVar11 ^ uVar29;
      uVar16 = ~uVar13 & uVar29 ^ uVar16;
      uVar33 = uVar33 ^ uVar3;
      uVar10 = uVar10 ^ uVar3;
      uVar7 = uVar26 >> 3 | uVar26 << 0x3d;
      uVar10 = uVar10 >> 0x3d | uVar10 << 3;
      uVar24 = uVar24 ^ uVar40;
      uVar24 = uVar24 >> 0x2c | uVar24 << 0x14;
      uVar8 = uVar8 ^ uVar31;
      uVar29 = uVar8 >> 0x24 | uVar8 << 0x1c;
      uVar36 = uVar36 ^ uVar28;
      uVar36 = uVar36 >> 0x13 | uVar36 << 0x2d;
      uVar25 = ~uVar7 & uVar29 ^ uVar36;
      uVar26 = ~uVar36 & uVar7 ^ uVar10;
      uVar14 = ~uVar10 & uVar36 ^ uVar24;
      uVar8 = ~uVar24 & uVar10 ^ uVar29;
      uVar7 = ~uVar29 & uVar24 ^ uVar7;
      uVar36 = uVar33 >> 0x2e | uVar33 << 0x12;
      uVar20 = uVar20 ^ uVar40;
      uVar23 = uVar23 ^ uVar31;
      uVar17 = uVar17 ^ uVar28;
      uVar20 = uVar20 >> 0x38 | uVar20 << 8;
      uVar10 = uVar23 >> 0x27 | uVar23 << 0x19;
      uVar29 = uVar17 >> 0x3f | uVar17 << 1;
      uVar13 = ~uVar20 & uVar36 ^ uVar10;
      uVar33 = ~uVar36 & uVar29 ^ uVar20;
      uVar22 = uVar22 ^ uVar19;
      uVar24 = uVar22 >> 0x3a | uVar22 << 6;
      uVar27 = ~uVar10 & uVar20 ^ uVar24;
      uVar17 = ~uVar24 & uVar10 ^ uVar29;
      uVar1 = uVar1 ^ uVar3;
      uVar36 = ~uVar29 & uVar24 ^ uVar36;
      uVar10 = uVar1 >> 0x1c | uVar1 << 0x24;
      uVar5 = uVar5 ^ uVar19;
      uVar19 = uVar19 ^ uVar38;
      uVar21 = uVar21 ^ uVar28;
      uVar28 = uVar28 ^ uVar6;
      uVar22 = uVar21 >> 0x36 | uVar21 << 10;
      uVar30 = uVar30 ^ uVar40;
      uVar40 = uVar40 ^ uVar18;
      uVar18 = uVar19 >> 2 | uVar19 << 0x3e;
      uVar23 = uVar30 >> 0x25 | uVar30 << 0x1b;
      uVar29 = ~uVar10 & uVar22 ^ uVar23;
      uVar30 = uVar5 >> 0x31 | uVar5 << 0xf;
      uVar1 = ~uVar22 & uVar30 ^ uVar10;
      uVar37 = uVar37 ^ uVar31;
      uVar31 = uVar31 ^ uVar35;
      uVar24 = uVar37 >> 8 | uVar37 << 0x38;
      uVar22 = ~uVar30 & uVar24 ^ uVar22;
      uVar5 = ~uVar23 & uVar10 ^ uVar24;
      uVar30 = ~uVar24 & uVar23 ^ uVar30;
      uVar10 = uVar31 >> 9 | uVar31 << 0x37;
      uVar3 = uVar3 ^ uVar2;
      uVar24 = uVar40 >> 0x19 | uVar40 << 0x27;
      uVar2 = uVar28 >> 0x3e | uVar28 << 2;
      uVar3 = uVar3 >> 0x17 | uVar3 << 0x29;
      uVar28 = ~uVar2 & uVar18 ^ uVar3;
      uVar40 = ~uVar3 & uVar2 ^ uVar24;
      uVar21 = uVar33 ^ uVar30 ^ uVar12 ^ uVar25 ^ uVar28;
      uVar38 = ~uVar24 & uVar3 ^ uVar10;
      uVar2 = ~uVar18 & uVar10 ^ uVar2;
      uVar18 = ~uVar10 & uVar24 ^ uVar18;
      uVar19 = uVar13 ^ uVar22 ^ uVar32 ^ uVar26 ^ uVar40;
      uVar3 = uVar27 ^ uVar1 ^ uVar11 ^ uVar14 ^ uVar38;
      uVar24 = uVar36 ^ uVar5 ^ uVar16 ^ uVar7 ^ uVar2;
      uVar10 = uVar17 ^ uVar29 ^ uVar4 ^ uVar8 ^ uVar18;
      uVar31 = (uVar21 >> 0x3f | uVar21 << 1) ^ uVar3;
      uVar34 = (uVar19 >> 0x3f | uVar19 << 1) ^ uVar10;
      uVar35 = (uVar3 >> 0x3f | uVar3 << 1) ^ uVar24;
      uVar19 = (uVar24 >> 0x3f | uVar24 << 1) ^ uVar19;
      uVar40 = uVar40 ^ uVar31;
      uVar21 = (uVar10 >> 0x3f | uVar10 << 1) ^ uVar21;
      uVar30 = uVar30 ^ uVar19;
      uVar24 = uVar40 >> 3 | uVar40 << 0x3d;
      uVar18 = uVar18 ^ uVar35;
      uVar2 = uVar2 ^ uVar21;
      uVar40 = uVar30 >> 0x2b | uVar30 << 0x15;
      uVar30 = uVar18 >> 0x2e | uVar18 << 0x12;
      uVar3 = uVar2 >> 0x32 | uVar2 << 0xe;
      uVar4 = uVar4 ^ uVar35;
      uVar14 = uVar14 ^ uVar34;
      uVar2 = uVar14 >> 0x14 | uVar14 << 0x2c;
      uVar13 = uVar13 ^ uVar31;
      uVar18 = uVar13 >> 0x15 | uVar13 << 0x2b;
      uVar10 = ~uVar40 & uVar3 ^ uVar18;
      uVar14 = uVar4 ^ 0x80000001 ^ ~uVar2 & uVar18;
      uVar37 = ~uVar18 & uVar40 ^ uVar2;
      uVar18 = ~uVar4 & uVar2 ^ uVar3;
      uVar40 = ~uVar3 & uVar4 ^ uVar40;
      uVar12 = uVar12 ^ uVar19;
      uVar7 = uVar7 ^ uVar21;
      uVar3 = uVar12 >> 0x24 | uVar12 << 0x1c;
      uVar7 = uVar7 >> 0x2c | uVar7 << 0x14;
      uVar17 = uVar17 ^ uVar35;
      uVar23 = uVar17 >> 0x3d | uVar17 << 3;
      uVar1 = uVar1 ^ uVar34;
      uVar12 = uVar1 >> 0x13 | uVar1 << 0x2d;
      uVar17 = ~uVar24 & uVar3 ^ uVar12;
      uVar2 = ~uVar23 & uVar12 ^ uVar7;
      uVar12 = ~uVar12 & uVar24 ^ uVar23;
      uVar1 = ~uVar7 & uVar23 ^ uVar3;
      uVar24 = ~uVar3 & uVar7 ^ uVar24;
      uVar5 = uVar5 ^ uVar21;
      uVar11 = uVar11 ^ uVar34;
      uVar5 = uVar5 >> 0x38 | uVar5 << 8;
      uVar3 = uVar11 >> 0x3f | uVar11 << 1;
      uVar33 = uVar33 ^ uVar19;
      uVar11 = uVar33 >> 0x27 | uVar33 << 0x19;
      uVar4 = ~uVar30 & uVar3 ^ uVar5;
      uVar20 = ~uVar5 & uVar30 ^ uVar11;
      uVar26 = uVar26 ^ uVar31;
      uVar7 = uVar26 >> 0x3a | uVar26 << 6;
      uVar6 = ~uVar11 & uVar5 ^ uVar7;
      uVar23 = ~uVar7 & uVar11 ^ uVar3;
      uVar30 = ~uVar3 & uVar7 ^ uVar30;
      uVar27 = uVar27 ^ uVar34;
      uVar34 = uVar34 ^ uVar38;
      uVar16 = uVar16 ^ uVar21;
      uVar7 = uVar27 >> 0x36 | uVar27 << 10;
      uVar21 = uVar21 ^ uVar36;
      uVar11 = uVar16 >> 0x25 | uVar16 << 0x1b;
      uVar8 = uVar8 ^ uVar35;
      uVar35 = uVar35 ^ uVar29;
      uVar36 = uVar8 >> 0x1c | uVar8 << 0x24;
      uVar5 = uVar34 >> 0x3e | uVar34 << 2;
      uVar16 = ~uVar36 & uVar7 ^ uVar11;
      uVar28 = uVar28 ^ uVar19;
      uVar19 = uVar19 ^ uVar25;
      uVar22 = uVar22 ^ uVar31;
      uVar31 = uVar31 ^ uVar32;
      uVar29 = uVar22 >> 0x31 | uVar22 << 0xf;
      uVar8 = ~uVar7 & uVar29 ^ uVar36;
      uVar3 = uVar28 >> 8 | uVar28 << 0x38;
      uVar32 = uVar35 >> 0x17 | uVar35 << 0x29;
      uVar7 = ~uVar29 & uVar3 ^ uVar7;
      uVar26 = ~uVar11 & uVar36 ^ uVar3;
      uVar29 = ~uVar3 & uVar11 ^ uVar29;
      uVar25 = uVar31 >> 2 | uVar31 << 0x3e;
      uVar11 = uVar21 >> 0x19 | uVar21 << 0x27;
      uVar3 = uVar19 >> 9 | uVar19 << 0x37;
      uVar22 = ~uVar5 & uVar25 ^ uVar32;
      uVar27 = ~uVar32 & uVar5 ^ uVar11;
      uVar36 = uVar4 ^ uVar29 ^ uVar40 ^ uVar17 ^ uVar22;
      uVar13 = ~uVar11 & uVar32 ^ uVar3;
      uVar5 = ~uVar25 & uVar3 ^ uVar5;
      uVar25 = ~uVar3 & uVar11 ^ uVar25;
      uVar31 = uVar20 ^ uVar7 ^ uVar10 ^ uVar12 ^ uVar27;
      uVar19 = uVar6 ^ uVar8 ^ uVar37 ^ uVar2 ^ uVar13;
      uVar3 = uVar30 ^ uVar26 ^ uVar18 ^ uVar24 ^ uVar5;
      uVar11 = uVar23 ^ uVar16 ^ uVar14 ^ uVar1 ^ uVar25;
      uVar32 = (uVar36 >> 0x3f | uVar36 << 1) ^ uVar19;
      uVar33 = (uVar19 >> 0x3f | uVar19 << 1) ^ uVar3;
      uVar19 = (uVar3 >> 0x3f | uVar3 << 1) ^ uVar31;
      uVar36 = (uVar11 >> 0x3f | uVar11 << 1) ^ uVar36;
      uVar27 = uVar27 ^ uVar32;
      uVar11 = (uVar31 >> 0x3f | uVar31 << 1) ^ uVar11;
      uVar29 = uVar29 ^ uVar19;
      uVar5 = uVar5 ^ uVar36;
      uVar25 = uVar25 ^ uVar33;
      uVar22 = uVar22 ^ uVar19;
      uVar2 = uVar2 ^ uVar11;
      uVar31 = uVar29 >> 0x2b | uVar29 << 0x15;
      local_e0 = uVar5 >> 0x32 | uVar5 << 0xe;
      uVar3 = uVar25 >> 0x2e | uVar25 << 0x12;
      uVar29 = uVar2 >> 0x14 | uVar2 << 0x2c;
      uVar14 = uVar14 ^ uVar33;
      uVar20 = uVar20 ^ uVar32;
      uVar2 = uVar20 >> 0x15 | uVar20 << 0x2b;
      local_140 = uVar14 ^ 0x8000000080008008 ^ ~uVar29 & uVar2;
      local_d0 = ~uVar31 & local_e0 ^ uVar2;
      local_130 = ~local_e0 & uVar14 ^ uVar31;
      local_138 = ~uVar2 & uVar31 ^ uVar29;
      local_e0 = ~uVar14 & uVar29 ^ local_e0;
      local_120 = uVar27 >> 3 | uVar27 << 0x3d;
      uVar8 = uVar8 ^ uVar11;
      uVar40 = uVar40 ^ uVar19;
      uVar23 = uVar23 ^ uVar33;
      uVar5 = uVar8 >> 0x13 | uVar8 << 0x2d;
      uVar29 = uVar40 >> 0x24 | uVar40 << 0x1c;
      uVar8 = uVar23 >> 0x3d | uVar23 << 3;
      local_f0 = ~local_120 & uVar29 ^ uVar5;
      local_d8 = ~uVar5 & local_120 ^ uVar8;
      uVar24 = uVar24 ^ uVar36;
      uVar2 = uVar24 >> 0x2c | uVar24 << 0x14;
      local_128 = ~uVar8 & uVar5 ^ uVar2;
      local_e8 = ~uVar2 & uVar8 ^ uVar29;
      local_120 = ~uVar29 & uVar2 ^ local_120;
      uVar26 = uVar26 ^ uVar36;
      uVar24 = uVar26 >> 0x38 | uVar26 << 8;
      uVar12 = uVar12 ^ uVar32;
      uVar37 = uVar37 ^ uVar11;
      uVar2 = uVar12 >> 0x3a | uVar12 << 6;
      uVar29 = uVar37 >> 0x3f | uVar37 << 1;
      local_148 = ~uVar3 & uVar29 ^ uVar24;
      uVar4 = uVar4 ^ uVar19;
      uVar19 = uVar19 ^ uVar17;
      uVar12 = uVar4 >> 0x27 | uVar4 << 0x19;
      local_100 = ~uVar12 & uVar24 ^ uVar2;
      local_118 = ~uVar24 & uVar3 ^ uVar12;
      local_f8 = ~uVar2 & uVar12 ^ uVar29;
      uVar3 = ~uVar29 & uVar2 ^ uVar3;
      local_158 = uVar22 >> 8 | uVar22 << 0x38;
      uVar18 = uVar18 ^ uVar36;
      uVar7 = uVar7 ^ uVar32;
      uVar32 = uVar32 ^ uVar10;
      uVar36 = uVar36 ^ uVar30;
      uVar29 = uVar18 >> 0x25 | uVar18 << 0x1b;
      uVar6 = uVar6 ^ uVar11;
      uVar11 = uVar11 ^ uVar13;
      uVar12 = uVar7 >> 0x31 | uVar7 << 0xf;
      uVar30 = uVar6 >> 0x36 | uVar6 << 10;
      local_110 = ~local_158 & uVar29 ^ uVar12;
      local_150 = ~uVar12 & local_158 ^ uVar30;
      uVar1 = uVar1 ^ uVar33;
      uVar33 = uVar33 ^ uVar16;
      uVar2 = uVar11 >> 0x3e | uVar11 << 2;
      uVar7 = uVar1 >> 0x1c | uVar1 << 0x24;
      local_108 = ~uVar30 & uVar12 ^ uVar7;
      uVar36 = uVar36 >> 0x19 | uVar36 << 0x27;
      uVar16 = ~uVar7 & uVar30 ^ uVar29;
      local_98 = uVar19 >> 9 | uVar19 << 0x37;
      local_158 = ~uVar29 & uVar7 ^ local_158;
      uVar30 = uVar32 >> 2 | uVar32 << 0x3e;
      uVar7 = uVar33 >> 0x17 | uVar33 << 0x29;
      uVar29 = ~local_98 & uVar36 ^ uVar30;
      local_b8 = ~uVar2 & uVar30 ^ uVar7;
      local_c0 = ~uVar30 & local_98 ^ uVar2;
      local_c8 = ~uVar7 & uVar2 ^ uVar36;
      local_98 = ~uVar36 & uVar7 ^ local_98;
      data = (uchar *)((long)data + (ulong)laneCount * 8);
      uVar15 = uVar15 - uVar9;
    } while (uVar9 <= uVar15);
  }
  *(ulong *)state = local_140;
  *(ulong *)((long)state + 8) = local_138;
  *(ulong *)((long)state + 0x10) = local_d0;
  *(ulong *)((long)state + 0x18) = local_130;
  *(ulong *)((long)state + 0x20) = local_e0;
  *(ulong *)((long)state + 0x28) = local_e8;
  *(ulong *)((long)state + 0x30) = local_128;
  *(ulong *)((long)state + 0x38) = local_d8;
  *(ulong *)((long)state + 0x40) = local_f0;
  *(ulong *)((long)state + 0x48) = local_120;
  *(ulong *)((long)state + 0x50) = local_f8;
  *(ulong *)((long)state + 0x58) = local_100;
  *(ulong *)((long)state + 0x60) = local_118;
  *(ulong *)((long)state + 0x68) = local_148;
  *(ulong *)((long)state + 0x70) = uVar3;
  *(ulong *)((long)state + 0x78) = uVar16;
  *(ulong *)((long)state + 0x80) = local_108;
  *(ulong *)((long)state + 0x88) = local_150;
  *(ulong *)((long)state + 0x90) = local_110;
  *(ulong *)((long)state + 0x98) = local_158;
  *(ulong *)((long)state + 0xa0) = uVar29;
  *(ulong *)((long)state + 0xa8) = local_98;
  *(ulong *)((long)state + 0xb0) = local_c8;
  *(ulong *)((long)state + 0xb8) = local_b8;
  *(ulong *)((long)state + 0xc0) = local_c0;
  return dataByteLen - uVar15;
}

Assistant:

size_t KeccakF1600_FastLoop_Absorb(void *state, unsigned int laneCount, const unsigned char *data, size_t dataByteLen)
{
    size_t originalDataByteLen = dataByteLen;
    declareABCDE
    #ifndef KeccakP1600_fullUnrolling
    unsigned int i;
    #endif
    uint64_t *stateAsLanes = (uint64_t*)state;
    uint64_t *inDataAsLanes = (uint64_t*)data;

    copyFromState(A, stateAsLanes)
    while(dataByteLen >= laneCount*8) {
        addInput(A, inDataAsLanes, laneCount)
        rounds24
        inDataAsLanes += laneCount;
        dataByteLen -= laneCount*8;
    }
    copyToState(stateAsLanes, A)
    return originalDataByteLen - dataByteLen;
}